

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86_avx512::create_pipeline(Convolution_x86_avx512 *this,Option *opt)

{
  Mat *pMVar1;
  int *piVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  void *pvVar6;
  long *plVar7;
  _func_int *p_Var8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  uint num_input;
  int iVar13;
  int iVar14;
  int iVar15;
  _func_int **pp_Var16;
  Layer *pLVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  byte bVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  _func_int **pp_Var26;
  long lVar27;
  long lVar28;
  undefined4 *puVar29;
  byte bVar30;
  int k_5;
  int iVar31;
  uint uVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  int k_1;
  _func_int *p_Var39;
  long lVar40;
  long lVar41;
  int k;
  ulong uVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  int iVar46;
  ulong uVar47;
  long lVar48;
  long lVar49;
  undefined4 *puVar50;
  int iVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  undefined4 *puVar56;
  int k_6;
  int iVar57;
  ulong uVar58;
  undefined4 *puVar59;
  long lVar60;
  long lVar61;
  int iVar62;
  long lVar63;
  int iVar64;
  uint _c;
  _func_int **pp_Var65;
  long lVar66;
  long lVar67;
  long lVar68;
  int iVar69;
  long lVar70;
  long lVar71;
  long lVar72;
  long lVar73;
  int k_8;
  int iVar74;
  int iVar75;
  _func_int **pp_Var76;
  _func_int **pp_Var77;
  _func_int *p_Var78;
  long lVar79;
  ulong uVar80;
  uint uVar81;
  uint uVar82;
  long lVar83;
  long lVar84;
  long lVar85;
  bool bVar86;
  ulong local_368;
  long local_358;
  long local_350;
  long local_340;
  long local_330;
  long local_328;
  long local_320;
  ulong local_318;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2a8;
  long local_2a0;
  long local_288;
  long local_280;
  long local_278;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  ParamDict pd_6;
  ParamDict pd;
  undefined1 local_1d8 [8];
  int local_1d0;
  Allocator *local_1c8;
  int iStack_1c0;
  int iStack_1bc;
  size_t sStack_1b8;
  int local_1b0 [2];
  size_t local_1a8 [2];
  undefined4 uStack_198;
  undefined4 uStack_194;
  size_t local_190;
  undefined4 local_188;
  undefined8 local_180;
  undefined4 uStack_178;
  undefined4 uStack_174;
  size_t sStack_170;
  undefined4 local_168;
  undefined8 local_160;
  long local_150;
  _func_int *local_148;
  long local_140;
  ulong local_138;
  long local_130;
  long local_128;
  uint local_11c;
  ParamDict pd_5;
  size_t local_108;
  int local_b0;
  ulong local_a8;
  ModelBinFromMatArray local_48;
  void *local_38;
  
  pp_Var16 = this->_vptr_Convolution_x86_avx512;
  p_Var39 = pp_Var16[-3];
  if (*(int *)((long)&(this->weight_winograd63_data).allocator + (long)p_Var39) != 0) {
    return 0;
  }
  switch(*(undefined4 *)(&(this->weight_winograd43_data).field_0x1c + (long)p_Var39)) {
  case 1:
    pLVar17 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar17->_vptr_Layer[2])(pLVar17,&pd);
    break;
  case 2:
    pLVar17 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var39));
    (*pLVar17->_vptr_Layer[2])(pLVar17,&pd);
    goto LAB_001c9b6d;
  case 3:
    pLVar17 = create_layer(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var39));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).allocator +
                                             (long)p_Var39) + 4));
    (*pLVar17->_vptr_Layer[2])(pLVar17,&pd);
    goto LAB_001c9b6d;
  case 4:
    pLVar17 = create_layer(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar17->_vptr_Layer[2])(pLVar17,&pd);
    break;
  case 5:
    pLVar17 = create_layer(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar17->_vptr_Layer[2])(pLVar17,&pd);
    break;
  case 6:
    pLVar17 = create_layer(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var39));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).allocator +
                                             (long)p_Var39) + 4));
    (*pLVar17->_vptr_Layer[2])(pLVar17,&pd);
LAB_001c9b6d:
    ParamDict::~ParamDict(&pd);
    goto LAB_001c9b82;
  default:
    pLVar17 = (Layer *)0x0;
    goto LAB_001c9b92;
  }
  ParamDict::~ParamDict(&pd);
LAB_001c9b82:
  (*pLVar17->_vptr_Layer[4])(pLVar17,opt);
  pp_Var16 = this->_vptr_Convolution_x86_avx512;
LAB_001c9b92:
  this->activation = pLVar17;
  this->nT = opt->num_threads;
  p_Var39 = pp_Var16[-3];
  if ((opt->use_int8_inference == true) &&
     (*(long *)((long)&(this->weight_winograd63_data).c + (long)p_Var39) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  uVar81 = *(uint *)((long)&(this->weight_winograd23_data).dims + (long)p_Var39);
  iVar31 = *(int *)((long)&(this->weight_winograd23_data).w + (long)p_Var39);
  iVar23 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var39);
  uVar47 = (long)*(int *)((long)&(this->weight_winograd43_data).elemsize + (long)(p_Var39 + 4)) /
           (long)(iVar23 * iVar31);
  uVar47 = (long)((ulong)(uint)((int)uVar47 >> 0x1f) << 0x20 | uVar47 & 0xffffffff) /
           (long)(int)uVar81;
  if ((((iVar31 == iVar23 && opt->use_packing_layout == false) &&
       (iVar74 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var39), iVar74 != 1)) &&
      (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var39) == iVar74)) &&
     ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var39) == 1 &&
      (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var39) == 1)))) {
    pLVar17 = create_layer(6);
    this->convolution_dilation1 = pLVar17;
    ParamDict::ParamDict(&pd_5);
    ParamDict::set(&pd_5,0,*(int *)((long)&(this->weight_winograd23_data).dims +
                                   (long)this->_vptr_Convolution_x86_avx512[-3]));
    ParamDict::set(&pd_5,1,*(int *)((long)&(this->weight_winograd23_data).w +
                                   (long)this->_vptr_Convolution_x86_avx512[-3]));
    ParamDict::set(&pd_5,0xb,
                   *(int *)((long)&(this->weight_winograd23_data).h +
                           (long)this->_vptr_Convolution_x86_avx512[-3]));
    ParamDict::set(&pd_5,2,1);
    ParamDict::set(&pd_5,0xc,1);
    ParamDict::set(&pd_5,3,1);
    ParamDict::set(&pd_5,0xd,1);
    ParamDict::set(&pd_5,4,0);
    ParamDict::set(&pd_5,0xe,0);
    ParamDict::set(&pd_5,5,*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                   (long)this->_vptr_Convolution_x86_avx512[-3]));
    ParamDict::set(&pd_5,6,*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                   (long)(this->_vptr_Convolution_x86_avx512[-3] + 4)));
    (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
    pp_Var16 = this->_vptr_Convolution_x86_avx512;
    if (*(int *)((long)&(this->weight_winograd43_data).elemsize + (long)pp_Var16[-3]) == 0) {
      local_1a8[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_1d8 = SUB128(ZEXT812(0),4);
      local_1d0 = 0;
      local_1c8 = (Allocator *)0x0;
      iStack_1c0 = 0;
      local_1b0[0] = 0;
      p_Var39 = pp_Var16[-3];
      iStack_1bc = pd.d._4_4_;
      sStack_1b8 = (size_t)local_1d8;
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).dims + (long)p_Var39)) {
        piVar2 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var39);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).dims + (long)p_Var39);
        uVar9 = *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var39);
        pd.d._0_4_ = (undefined4)uVar9;
        pd.d._4_4_ = (int)((ulong)uVar9 >> 0x20);
        local_1d8 = *(undefined1 (*) [8])((long)&(this->weight_winograd63_data).c + (long)p_Var39);
        local_1d0 = *(int *)((long)&(this->weight_winograd63_data).cstep + (long)p_Var39);
        local_1c8 = *(Allocator **)((long)&this->convolution_dilation1 + (long)p_Var39);
        uVar9 = *(undefined8 *)((long)&this->gemm + (long)p_Var39);
        sStack_1b8 = *(size_t *)((long)&(this->scale_in_data).data + (long)p_Var39);
        iStack_1c0 = (int)uVar9;
        iStack_1bc = (int)((ulong)uVar9 >> 0x20);
        local_1b0[0] = *(int *)((long)&(this->scale_in_data).refcount + (long)p_Var39);
        local_1a8[0] = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var39);
      }
      pLVar17 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6,(Mat *)&pd);
      (*pLVar17->_vptr_Layer[3])(pLVar17,&pd_6);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6);
      piVar2 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_1c8 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_1c8->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      local_1a8[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_1d8 = SUB128(ZEXT812(0),4);
      local_1d0 = 0;
      local_1c8 = (Allocator *)0x0;
      iStack_1c0 = 0;
      local_1b0[0] = 0;
      p_Var39 = pp_Var16[-3];
      iStack_1bc = pd.d._4_4_;
      sStack_1b8 = (size_t)local_1d8;
      sStack_170 = (size_t)local_1d8;
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).dims + (long)p_Var39)) {
        piVar2 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var39);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).dims + (long)p_Var39);
        uVar9 = *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var39);
        pd.d._0_4_ = (undefined4)uVar9;
        pd.d._4_4_ = (int)((ulong)uVar9 >> 0x20);
        local_1d8 = *(undefined1 (*) [8])((long)&(this->weight_winograd63_data).c + (long)p_Var39);
        local_1d0 = *(int *)((long)&(this->weight_winograd63_data).cstep + (long)p_Var39);
        local_1c8 = *(Allocator **)((long)&this->convolution_dilation1 + (long)p_Var39);
        uVar9 = *(undefined8 *)((long)&this->gemm + (long)p_Var39);
        sStack_1b8 = *(size_t *)((long)&(this->scale_in_data).data + (long)p_Var39);
        iStack_1c0 = (int)uVar9;
        iStack_1bc = (int)((ulong)uVar9 >> 0x20);
        local_1b0[0] = *(int *)((long)&(this->scale_in_data).refcount + (long)p_Var39);
        local_1a8[0] = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var39);
        p_Var39 = this->_vptr_Convolution_x86_avx512[-3];
      }
      local_160 = 0;
      local_168 = 0;
      uStack_174 = 0;
      uStack_178 = 0;
      local_180 = 0;
      local_188 = 0;
      uStack_194 = 0;
      uStack_198 = 0;
      local_1a8[1] = 0;
      local_190 = sStack_170;
      if ((_func_int *)(local_1a8 + 1) !=
          (_func_int *)((long)&(this->scale_in_data).elempack + (long)p_Var39)) {
        piVar2 = *(int **)((long)&(this->scale_in_data).allocator + (long)p_Var39);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        local_1a8[1] = *(size_t *)((long)&(this->scale_in_data).elempack + (long)p_Var39);
        uVar9 = *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var39);
        uStack_198 = (undefined4)uVar9;
        uStack_194 = (undefined4)((ulong)uVar9 >> 0x20);
        local_190 = *(size_t *)((long)&(this->scale_in_data).dims + (long)p_Var39);
        local_188 = *(undefined4 *)((long)&(this->scale_in_data).h + (long)p_Var39);
        local_180 = *(undefined8 *)((long)&(this->scale_in_data).c + (long)p_Var39);
        uVar9 = *(undefined8 *)((long)&(this->scale_in_data).cstep + (long)p_Var39);
        sStack_170 = *(size_t *)(&this->field_0x1d8 + (long)p_Var39);
        uStack_178 = (undefined4)uVar9;
        uStack_174 = (undefined4)((ulong)uVar9 >> 0x20);
        local_168 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var39);
        local_160 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var39);
      }
      pLVar17 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6,(Mat *)&pd);
      (*pLVar17->_vptr_Layer[3])(pLVar17,&pd_6);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6);
      lVar41 = 0x48;
      do {
        piVar2 = *(int **)((long)&pd.d + lVar41);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar6 = *(void **)((long)&pd._vptr_ParamDict + lVar41);
            if (*(long **)((long)&local_1c8 + lVar41) == (long *)0x0) {
              if (pvVar6 != (void *)0x0) {
                free(pvVar6);
              }
            }
            else {
              (**(code **)(**(long **)((long)&local_1c8 + lVar41) + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)local_1a8 + lVar41) = 0;
        *(undefined8 *)((long)&pd.d + lVar41 + 4) = 0;
        *(undefined8 *)(local_1d8 + lVar41 + 4) = 0;
        *(undefined8 *)((long)&pd._vptr_ParamDict + lVar41) = 0;
        *(undefined8 *)((long)&pd.d + lVar41) = 0;
        *(undefined8 *)((long)&iStack_1c0 + lVar41) = 0;
        *(undefined8 *)((long)local_1b0 + lVar41 + -8) = 0;
        *(undefined4 *)((long)local_1b0 + lVar41) = 0;
        lVar41 = lVar41 + -0x48;
      } while (lVar41 != -0x48);
    }
    (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
    if (opt->lightmode == true) {
      p_Var39 = this->_vptr_Convolution_x86_avx512[-3];
      piVar2 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var39);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          pvVar6 = *(void **)((long)&(this->weight_winograd63_data).dims + (long)p_Var39);
          plVar7 = *(long **)((long)&this->convolution_dilation1 + (long)p_Var39);
          if (plVar7 == (long *)0x0) {
            if (pvVar6 != (void *)0x0) {
              free(pvVar6);
            }
          }
          else {
            (**(code **)(*plVar7 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var39) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).d + (long)p_Var39) = 0;
      *(undefined8 *)(&(this->weight_winograd63_data).field_0x3c + (long)p_Var39) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).dims + (long)p_Var39) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var39) = 0;
      *(undefined8 *)((long)&this->gemm + (long)p_Var39) = 0;
      *(undefined8 *)((long)&(this->scale_in_data).data + (long)p_Var39) = 0;
      *(undefined4 *)((long)&(this->scale_in_data).refcount + (long)p_Var39) = 0;
    }
    ParamDict::~ParamDict(&pd_5);
    return 0;
  }
  num_input = (uint)uVar47;
  iVar74 = 1;
  uVar58 = 1;
  if (opt->use_packing_layout != false) {
    iVar74 = 0x10;
    uVar58 = 0x10;
    if ((uVar47 & 0xf) != 0) {
      if ((uVar47 & 7) == 0) {
        uVar58 = 8;
      }
      else {
        uVar58 = (ulong)((uint)((uVar47 & 3) == 0) * 3 + 1);
      }
    }
    if ((uVar81 & 0xf) != 0) {
      if ((uVar81 & 7) == 0) {
        iVar74 = 8;
      }
      else {
        iVar74 = (uint)((uVar81 & 3) == 0) * 3 + 1;
      }
    }
  }
  bVar30 = opt->use_winograd23_convolution;
  if ((((bool)bVar30 == false) && (opt->use_winograd43_convolution == false)) &&
     (opt->use_winograd63_convolution != true)) {
LAB_001c9f8b:
    iVar13 = get_cpu_level2_cache_size();
    p_Var39 = this->_vptr_Convolution_x86_avx512[-3];
    uVar81 = *(uint *)((long)&(this->weight_winograd23_data).dims + (long)p_Var39);
    iVar31 = *(int *)((long)&(this->weight_winograd23_data).w + (long)p_Var39);
    iVar23 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var39);
    iVar46 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var39);
    iVar62 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var39);
    iVar64 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var39);
    iVar14 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var39);
    iVar51 = (int)uVar58;
    if ((opt->use_sgemm_convolution == true) &&
       (iVar13 < (int)(uVar81 * iVar31 * iVar23 * iVar46 * iVar62 * iVar64 * iVar14 * num_input * 8)
        || (0x10 < (int)num_input || 0x10 < (int)uVar81))) {
LAB_001ca02c:
      pLVar17 = create_layer(0x4a);
      this->gemm = pLVar17;
      ParamDict::ParamDict(&pd_6);
      ParamDict::set(&pd_6,2,0);
      ParamDict::set(&pd_6,3,0);
      ParamDict::set(&pd_6,4,1);
      ParamDict::set(&pd_6,5,0);
      ParamDict::set(&pd_6,6,1);
      ParamDict::set(&pd_6,7,*(int *)((long)&(this->weight_winograd23_data).dims +
                                     (long)this->_vptr_Convolution_x86_avx512[-3]));
      ParamDict::set(&pd_6,8,0);
      uVar81 = iVar23 * iVar31;
      ParamDict::set(&pd_6,9,uVar81 * num_input);
      ParamDict::set(&pd_6,10,-(uint)(*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                              (long)this->_vptr_Convolution_x86_avx512[-3]) == 0) |
                              1);
      ParamDict::set(&pd_6,0xb,1);
      (*this->gemm->_vptr_Layer[2])(this->gemm,&pd_6);
      pd_5._vptr_ParamDict = (_func_int **)0x0;
      pd_5.d._0_4_ = 0;
      pd_5.d._4_4_ = 0;
      local_108 = SUB168(ZEXT816(0) << 0x40,4);
      pMVar1 = (Mat *)((long)&(this->weight_winograd63_data).dims +
                      (long)this->_vptr_Convolution_x86_avx512[-3]);
      Mat::reshape((Mat *)&pd,pMVar1,uVar81,num_input,*(int *)&pMVar1[-2].data,(Allocator *)0x0);
      Mat::create((Mat *)&pd_5,uVar81 * num_input,
                  *(int *)((long)&(this->weight_winograd23_data).dims +
                          (long)this->_vptr_Convolution_x86_avx512[-3]),4,(Allocator *)0x0);
      pp_Var16 = this->_vptr_Convolution_x86_avx512;
      p_Var39 = pp_Var16[-3];
      if (0 < *(int *)((long)&(this->weight_winograd23_data).dims + (long)p_Var39)) {
        lVar41 = 0;
        do {
          if (iVar51 <= (int)num_input) {
            pp_Var26 = (_func_int **)
                       ((long)local_1d8 * local_1a8[0] * lVar41 + (long)pd._vptr_ParamDict);
            lVar72 = 0;
            pp_Var65 = pd_5._vptr_ParamDict;
            do {
              if (0 < (int)uVar81) {
                uVar42 = 0;
                uVar47 = uVar58;
                pp_Var77 = pp_Var26;
                pp_Var76 = pp_Var26;
                do {
                  do {
                    *(undefined4 *)pp_Var65 = *(undefined4 *)pp_Var77;
                    pp_Var65 = (_func_int **)((long)pp_Var65 + 4);
                    uVar47 = uVar47 - 1;
                    pp_Var77 = (_func_int **)((long)pp_Var77 + (long)iStack_1bc * (long)local_1d8);
                  } while (uVar47 != 0);
                  uVar42 = uVar42 + 1;
                  pp_Var77 = (_func_int **)((long)pp_Var76 + 4);
                  uVar47 = uVar58;
                  pp_Var76 = pp_Var77;
                } while (uVar42 != uVar81);
              }
              lVar72 = lVar72 + uVar58;
              pp_Var26 = (_func_int **)
                         ((long)pp_Var26 + (long)iStack_1bc * (long)local_1d8 * uVar58);
            } while (lVar72 < (long)((long)(int)num_input - (ulong)(iVar51 - 1)));
            p_Var39 = pp_Var16[-3];
          }
          lVar41 = lVar41 + 1;
        } while (lVar41 < *(int *)((long)&(this->weight_winograd23_data).dims + (long)p_Var39));
      }
      piVar2 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_1c8 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_1c8->_vptr_Allocator[3])();
          }
        }
      }
      if (*(int *)((long)&(this->weight_winograd43_data).elemsize +
                  (long)this->_vptr_Convolution_x86_avx512[-3]) == 0) {
        piVar2 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pd.d._0_4_ = pd_5.d._0_4_;
        pd.d._4_4_ = pd_5.d._4_4_;
        local_1d8 = (undefined1  [8])local_108;
        local_1d0 = 0;
        local_1c8 = (Allocator *)0x0;
        iStack_1c0 = 0;
        iStack_1bc = 0;
        sStack_1b8 = local_108;
        local_1b0[0] = 0;
        local_1a8[0] = 0;
        pLVar17 = this->gemm;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_48,(Mat *)&pd);
        (*pLVar17->_vptr_Layer[3])(pLVar17,&local_48);
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_48);
        piVar2 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (local_1c8 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                free(pd._vptr_ParamDict);
              }
            }
            else {
              (*local_1c8->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        uStack_194 = 0;
        local_1d8 = SUB128(ZEXT812(0),4);
        local_160 = 0;
        local_1a8[1] = 0;
        uStack_198 = 0;
        local_188 = 0;
        local_180 = 0;
        uStack_178 = 0;
        local_168 = 0;
        piVar2 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        p_Var39 = this->_vptr_Convolution_x86_avx512[-3];
        local_190 = (size_t)local_1d8;
        uStack_174 = uStack_194;
        sStack_170 = (size_t)local_1d8;
        if ((_func_int *)(local_1a8 + 1) !=
            (_func_int *)((long)&(this->scale_in_data).elempack + (long)p_Var39)) {
          piVar2 = *(int **)((long)&(this->scale_in_data).allocator + (long)p_Var39);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          local_1a8[1] = *(size_t *)((long)&(this->scale_in_data).elempack + (long)p_Var39);
          uVar9 = *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var39);
          uStack_198 = (undefined4)uVar9;
          uStack_194 = (undefined4)((ulong)uVar9 >> 0x20);
          local_190 = *(size_t *)((long)&(this->scale_in_data).dims + (long)p_Var39);
          local_188 = *(undefined4 *)((long)&(this->scale_in_data).h + (long)p_Var39);
          local_180 = *(undefined8 *)((long)&(this->scale_in_data).c + (long)p_Var39);
          uVar9 = *(undefined8 *)((long)&(this->scale_in_data).cstep + (long)p_Var39);
          sStack_170 = *(size_t *)(&this->field_0x1d8 + (long)p_Var39);
          uStack_178 = (undefined4)uVar9;
          uStack_174 = (undefined4)((ulong)uVar9 >> 0x20);
          local_168 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var39);
          local_160 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var39);
        }
        local_1a8[0] = 0;
        local_1b0[0] = 0;
        iStack_1bc = 0;
        iStack_1c0 = 0;
        local_1c8 = (Allocator *)0x0;
        local_1d0 = 0;
        local_1d8 = (undefined1  [8])local_108;
        pd.d._4_4_ = pd_5.d._4_4_;
        pd.d._0_4_ = pd_5.d._0_4_;
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pLVar17 = this->gemm;
        sStack_1b8 = (size_t)local_1d8;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_48,(Mat *)&pd);
        (*pLVar17->_vptr_Layer[3])(pLVar17,&local_48);
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_48);
        lVar41 = 0x48;
        do {
          piVar2 = *(int **)((long)&pd.d + lVar41);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              pvVar6 = *(void **)((long)&pd._vptr_ParamDict + lVar41);
              if (*(long **)((long)&local_1c8 + lVar41) == (long *)0x0) {
                if (pvVar6 != (void *)0x0) {
                  free(pvVar6);
                }
              }
              else {
                (**(code **)(**(long **)((long)&local_1c8 + lVar41) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)local_1a8 + lVar41) = 0;
          *(undefined8 *)((long)&pd.d + lVar41 + 4) = 0;
          *(undefined8 *)(local_1d8 + lVar41 + 4) = 0;
          *(undefined8 *)((long)&pd._vptr_ParamDict + lVar41) = 0;
          *(undefined8 *)((long)&pd.d + lVar41) = 0;
          *(undefined8 *)((long)&iStack_1c0 + lVar41) = 0;
          *(undefined8 *)((long)local_1b0 + lVar41 + -8) = 0;
          *(undefined4 *)((long)local_1b0 + lVar41) = 0;
          lVar41 = lVar41 + -0x48;
        } while (lVar41 != -0x48);
      }
      (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
      piVar2 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if ((*piVar2 == 0) && (pd_5._vptr_ParamDict != (_func_int **)0x0)) {
          free(pd_5._vptr_ParamDict);
        }
      }
      ParamDict::~ParamDict(&pd_6);
    }
    else {
      p_Var39 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx512 + (long)p_Var39);
      if (iVar31 == 1) {
        if (iVar23 != 1) {
          bVar10 = iVar74 == 1;
          if ((bVar10) && (iVar51 == 0x10)) {
            bVar10 = true;
            bVar11 = false;
            goto LAB_001caa9e;
          }
          bVar86 = iVar51 == 8;
          bVar11 = (iVar74 != 8 || iVar51 != 8) && iVar51 == 1;
          goto LAB_001caaa1;
        }
        goto LAB_001ca02c;
      }
      bVar10 = iVar74 == 1;
      if ((bVar10) && (iVar51 == 0x10)) {
        bVar86 = false;
        bVar10 = true;
        bVar11 = false;
        if ((((iVar31 != 3) || (bVar11 = bVar86, iVar23 != 3)) || (iVar46 != 1)) ||
           ((iVar62 != 1 || (iVar64 != 1)))) {
LAB_001caa9e:
          bVar86 = false;
          goto LAB_001caaa1;
        }
        bVar86 = false;
LAB_001ca8cd:
        bVar11 = false;
        if (iVar14 == 1) goto LAB_001caae7;
LAB_001caaa1:
        if ((((bVar10) && (bVar86)) &&
            ((iVar31 == 3 && (((iVar23 == 3 && (iVar46 == 1)) && (iVar62 == 1)))))) &&
           ((iVar64 == 1 && (iVar14 == 1)))) goto LAB_001caae7;
        if ((!(bool)(bVar11 ^ 1U | iVar74 != 4)) &&
           (((iVar31 == 3 && (iVar23 == 3)) && ((iVar46 == 1 && (iVar62 == 1)))))) {
          if (iVar64 == 2) {
            if (iVar14 == 2) goto LAB_001caae7;
          }
          else if ((iVar64 == 1) && (iVar14 == 1)) goto LAB_001caae7;
        }
        uVar47 = (ulong)(int)uVar81;
        pMVar1 = &this->weight_data_tm;
        uVar82 = iVar23 * iVar31;
        lVar41 = (long)(int)uVar82;
        lVar72 = (long)(int)num_input;
        uVar58 = (ulong)uVar82;
        local_148 = p_Var39;
        local_11c = uVar81;
        if ((int)uVar81 < 0x10) {
          uVar32 = num_input;
          if ((int)uVar81 < 8) {
            if (3 < (int)uVar81) {
              if ((int)num_input < 0x10) {
                if ((int)num_input < 8) {
                  if ((int)num_input < 4) {
                    if ((int)num_input < 2) {
                      uVar24 = uVar82 * 4;
                      _c = (uVar81 & 1) + 1 + (uint)((uVar81 >> 1 & 1) != 0);
                    }
                    else {
                      uVar24 = uVar82 * 8;
                      uVar32 = (num_input & 1) + 1;
                      _c = (uVar81 & 1) + 1 + (uint)((uVar81 >> 1 & 1) != 0);
                    }
                    goto LAB_001ceec2;
                  }
                  iVar23 = uVar82 * 0x10;
                  iVar31 = (num_input & 1) + 1 + (uint)((num_input >> 1 & 1) != 0);
                  uVar24 = (uVar81 & 1) + 1 + (uint)((uVar81 >> 1 & 1) != 0);
                  goto LAB_001cc671;
                }
                iVar23 = uVar82 * 0x20;
                iVar31 = (num_input & 1) + 1 + (num_input >> 2 & 1) +
                         (uint)((num_input >> 1 & 1) != 0);
              }
              else {
                iVar23 = uVar82 * 0x40;
                iVar31 = (num_input & 1) + (num_input >> 4) + (uint)((num_input >> 3 & 1) != 0) +
                         (num_input >> 2 & 1) + (uint)((num_input >> 1 & 1) != 0);
              }
              uVar24 = (uVar81 & 1) + 1 + (uint)((uVar81 >> 1 & 1) != 0);
              goto LAB_001cc671;
            }
            if ((int)uVar81 < 2) {
              uVar24 = uVar81;
              if ((int)num_input < 0x10) {
                if ((int)num_input < 8) {
                  if ((int)num_input < 4) {
                    uVar24 = uVar82;
                    _c = uVar81;
                    if (1 < (int)num_input) {
                      uVar24 = uVar82 * 2;
                      uVar32 = (num_input & 1) + 1;
                    }
                    goto LAB_001ceec2;
                  }
                  iVar23 = uVar82 * 4;
                  iVar31 = (num_input & 1) + 1 + (uint)((num_input >> 1 & 1) != 0);
                }
                else {
                  iVar23 = uVar82 * 8;
                  iVar31 = (num_input & 1) + 1 + (num_input >> 2 & 1) +
                           (uint)((num_input >> 1 & 1) != 0);
                }
              }
              else {
                iVar23 = uVar82 * 0x10;
                iVar31 = (num_input & 1) + (num_input >> 4) + (uint)((num_input >> 3 & 1) != 0) +
                         (num_input >> 2 & 1) + (uint)((num_input >> 1 & 1) != 0);
              }
              goto LAB_001cc671;
            }
            if (0xf < (int)num_input) {
              iVar23 = uVar82 * 0x20;
              iVar31 = (num_input & 1) + (num_input >> 4) + (uint)((num_input >> 3 & 1) != 0) +
                       (num_input >> 2 & 1) + (uint)((num_input >> 1 & 1) != 0);
              uVar24 = (uVar81 & 1) + 1;
              goto LAB_001cc671;
            }
            if ((int)num_input < 8) {
              if (3 < (int)num_input) {
                iVar31 = (num_input & 1) + 1 + (uint)((num_input >> 1 & 1) != 0);
                iVar23 = uVar82 * 8;
                goto LAB_001ce8d2;
              }
              if ((int)num_input < 2) {
                uVar24 = uVar82 * 2;
                _c = (uVar81 & 1) + 1;
              }
              else {
                uVar24 = uVar82 * 4;
                uVar32 = (num_input & 1) + 1;
                _c = (uVar81 & 1) + 1;
              }
LAB_001ceec2:
              uVar42 = 0;
              Mat::create(pMVar1,uVar24,uVar32,_c,4,(Allocator *)0x0);
            }
            else {
              iVar23 = uVar82 * 0x10;
              iVar31 = (num_input & 1) + 1 + (num_input >> 2 & 1) +
                       (uint)((num_input >> 1 & 1) != 0);
LAB_001ce8d2:
              uVar42 = 0;
              Mat::create(pMVar1,iVar23,iVar31,(uVar81 & 1) + 1,4,(Allocator *)0x0);
            }
          }
          else {
            if ((int)num_input < 0x10) {
              if ((int)num_input < 8) {
                if ((int)num_input < 4) {
                  if ((int)num_input < 2) {
                    uVar24 = uVar82 * 8;
                    _c = (uVar81 & 1) + 1 + (uVar81 >> 2 & 1) + (uint)((uVar81 >> 1 & 1) != 0);
                  }
                  else {
                    uVar24 = uVar82 * 0x10;
                    _c = (uVar81 & 1) + 1 + ((uint)(uVar47 >> 2) & 1) +
                         (uint)((uVar81 >> 1 & 1) != 0);
                    uVar32 = (num_input & 1) + 1;
                  }
                  goto LAB_001ceec2;
                }
                iVar23 = uVar82 * 0x20;
                iVar31 = (num_input & 1) + 1 + (uint)((num_input >> 1 & 1) != 0);
                uVar24 = (uVar81 & 1) + 1 + (uVar81 >> 2 & 1) + (uint)((uVar81 >> 1 & 1) != 0);
              }
              else {
                iVar23 = uVar82 * 0x40;
                iVar31 = (num_input & 1) + 1 + (num_input >> 2 & 1) +
                         (uint)((num_input >> 1 & 1) != 0);
                uVar24 = (uVar81 & 1) + 1 + ((uint)(uVar47 >> 2) & 1) +
                         (uint)((uVar81 >> 1 & 1) != 0);
              }
            }
            else {
              iVar23 = uVar82 * 0x80;
              iVar31 = (num_input & 1) + (num_input >> 4) + (uint)((num_input >> 3 & 1) != 0) +
                       (num_input >> 2 & 1) + (uint)((num_input >> 1 & 1) != 0);
              uVar24 = (uVar81 & 1) + 1 + ((uint)(uVar47 >> 2) & 1) + (uint)((uVar81 >> 1 & 1) != 0)
              ;
            }
LAB_001cc671:
            uVar42 = 0;
            Mat::create(pMVar1,iVar23,iVar31,uVar24,4,(Allocator *)0x0);
          }
        }
        else {
          if ((int)num_input < 0x10) {
            if (7 < (int)num_input) {
              iVar31 = uVar82 * 0x80;
              uVar32 = (num_input & 1) + 1 + (num_input >> 2 & 1) +
                       (uint)((num_input >> 1 & 1) != 0);
              goto LAB_001cadf4;
            }
            if (3 < (int)num_input) {
              iVar31 = uVar82 * 0x40;
              uVar32 = (num_input & 1) + 1 + (uint)((num_input >> 1 & 1) != 0);
              goto LAB_001cadf4;
            }
            if (1 < (int)num_input) {
              iVar31 = uVar82 * 0x20;
              uVar32 = (num_input & 1) + 1;
              goto LAB_001cadf4;
            }
            iVar31 = uVar82 * 0x10;
            iVar23 = (uVar81 & 1) + (uVar81 >> 4) + (uint)((uVar81 >> 3 & 1) != 0) +
                     ((uint)(uVar47 >> 2) & 1) + (uint)((uVar81 >> 1 & 1) != 0);
            uVar32 = num_input;
          }
          else {
            iVar31 = uVar82 * 0x100;
            uVar32 = (num_input & 1) + (num_input >> 4) + (uint)((num_input >> 3 & 1) != 0) +
                     (num_input >> 2 & 1) + (uint)((num_input >> 1 & 1) != 0);
LAB_001cadf4:
            iVar23 = (uVar81 & 1) + (uVar81 >> 4) + (uint)((uVar81 >> 3 & 1) != 0) +
                     ((uint)(uVar47 >> 2) & 1) + (uint)((uVar81 >> 1 & 1) != 0);
          }
          Mat::create(pMVar1,iVar31,uVar32,iVar23,4,(Allocator *)0x0);
          iVar33 = uVar82 * num_input;
          sVar3 = (this->weight_data_tm).elemsize;
          sVar4 = (this->weight_data_tm).cstep;
          iVar14 = uVar82 * num_input;
          iVar51 = iVar14 * 2;
          iVar31 = iVar14 * 3;
          iVar57 = iVar14 * 4;
          iVar23 = iVar14 * 5;
          iVar69 = iVar14 * 8;
          iVar74 = iVar14 * 7;
          iVar46 = iVar14 * 9;
          iVar75 = iVar14 * 0xb;
          local_b0 = iVar14 * 0xd;
          iVar15 = iVar14 * 0x10;
          local_128 = uVar58 * 0x40;
          local_150 = CONCAT44(local_150._4_4_,iVar14 * 0xe);
          local_130 = lVar41 * 0x10;
          lVar5 = *(long *)(local_148 + 0x160);
          local_38 = (this->weight_data_tm).data;
          lVar34 = lVar41 * 4;
          iVar62 = iVar14 * 6;
          iVar64 = iVar14 * 10;
          iVar13 = iVar14 * 0xc;
          iVar14 = iVar14 * 0xf;
          local_138 = 0;
          uVar80 = 0;
          do {
            puVar59 = (undefined4 *)((uVar80 >> 4) * sVar3 * sVar4 + (long)local_38);
            local_140 = CONCAT44(local_140._4_4_,iVar33);
            iVar25 = (int)local_138;
            if ((int)num_input < 0x10) {
              local_368 = 0;
            }
            else {
              lVar67 = 0;
              uVar42 = 0;
              do {
                if (0 < (int)uVar82) {
                  uVar18 = 0;
                  lVar66 = lVar67;
                  do {
                    puVar29 = puVar59;
                    lVar35 = 0;
                    lVar60 = lVar66;
                    do {
                      *(undefined4 *)((long)puVar29 + lVar35) =
                           *(undefined4 *)(lVar5 + (long)iVar25 * 4 + lVar60);
                      *(undefined4 *)((long)puVar29 + lVar35 + 4) =
                           *(undefined4 *)(lVar5 + (long)iVar33 * 4 + lVar60);
                      *(undefined4 *)((long)puVar29 + lVar35 + 8) =
                           *(undefined4 *)(lVar5 + (long)iVar51 * 4 + lVar60);
                      *(undefined4 *)((long)puVar29 + lVar35 + 0xc) =
                           *(undefined4 *)(lVar5 + (long)iVar31 * 4 + lVar60);
                      *(undefined4 *)((long)puVar29 + lVar35 + 0x10) =
                           *(undefined4 *)(lVar5 + (long)iVar57 * 4 + lVar60);
                      *(undefined4 *)((long)puVar29 + lVar35 + 0x14) =
                           *(undefined4 *)(lVar5 + (long)iVar23 * 4 + lVar60);
                      *(undefined4 *)((long)puVar29 + lVar35 + 0x18) =
                           *(undefined4 *)(lVar5 + (long)iVar62 * 4 + lVar60);
                      *(undefined4 *)((long)puVar29 + lVar35 + 0x1c) =
                           *(undefined4 *)(lVar5 + (long)iVar74 * 4 + lVar60);
                      *(undefined4 *)((long)puVar29 + lVar35 + 0x20) =
                           *(undefined4 *)(lVar5 + (long)iVar69 * 4 + lVar60);
                      *(undefined4 *)((long)puVar29 + lVar35 + 0x24) =
                           *(undefined4 *)(lVar5 + (long)iVar46 * 4 + lVar60);
                      *(undefined4 *)((long)puVar29 + lVar35 + 0x28) =
                           *(undefined4 *)(lVar5 + (long)iVar64 * 4 + lVar60);
                      *(undefined4 *)((long)puVar29 + lVar35 + 0x2c) =
                           *(undefined4 *)(lVar5 + (long)iVar75 * 4 + lVar60);
                      *(undefined4 *)((long)puVar29 + lVar35 + 0x30) =
                           *(undefined4 *)(lVar5 + (long)iVar13 * 4 + lVar60);
                      *(undefined4 *)((long)puVar29 + lVar35 + 0x34) =
                           *(undefined4 *)(lVar5 + (long)local_b0 * 4 + lVar60);
                      *(undefined4 *)((long)puVar29 + lVar35 + 0x38) =
                           *(undefined4 *)(lVar5 + (long)(int)local_150 * 4 + lVar60);
                      *(undefined4 *)((long)puVar29 + lVar35 + 0x3c) =
                           *(undefined4 *)(lVar5 + (long)iVar14 * 4 + lVar60);
                      lVar35 = lVar35 + 0x40;
                      lVar60 = lVar60 + lVar34;
                    } while ((int)lVar35 != 0x400);
                    uVar18 = uVar18 + 1;
                    lVar66 = lVar66 + 4;
                    puVar59 = (undefined4 *)((long)puVar29 + lVar35);
                  } while (uVar18 != uVar58);
                  puVar59 = (undefined4 *)((long)puVar29 + lVar35);
                }
                local_368 = uVar42 + 0x10;
                lVar66 = uVar42 + 0x1f;
                lVar67 = lVar67 + local_128;
                uVar42 = local_368;
              } while (lVar66 < lVar72);
            }
            lVar67 = (long)iVar14 * 4;
            lVar48 = (long)(int)local_150 * 4;
            lVar43 = (long)local_b0 * 4;
            lVar52 = (long)iVar13 * 4;
            lVar83 = (long)iVar75 * 4;
            lVar66 = (long)iVar64 * 4;
            lVar79 = (long)iVar46 * 4;
            lVar60 = (long)iVar69 * 4;
            lVar68 = (long)iVar74 * 4;
            lVar35 = (long)iVar62 * 4;
            lVar36 = (long)iVar23 * 4;
            lVar53 = (long)iVar57 * 4;
            lVar63 = (long)iVar31 * 4;
            lVar70 = (long)iVar51 * 4;
            lVar40 = (long)iVar33 * 4;
            lVar27 = (long)iVar25 * 4;
            if ((int)((uint)local_368 | 7) < (int)num_input) {
              lVar44 = lVar34 * (local_368 & 0xffffffff);
              local_2d0 = 0;
              uVar42 = local_368 & 0xffffffff;
              do {
                if (0 < (int)uVar82) {
                  uVar18 = 0;
                  lVar19 = local_2d0;
                  do {
                    puVar29 = puVar59;
                    lVar28 = 0;
                    lVar61 = lVar19;
                    do {
                      *(undefined4 *)((long)puVar29 + lVar28) =
                           *(undefined4 *)(lVar27 + lVar44 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 4) =
                           *(undefined4 *)(lVar40 + lVar44 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 8) =
                           *(undefined4 *)(lVar70 + lVar44 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0xc) =
                           *(undefined4 *)(lVar63 + lVar44 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x10) =
                           *(undefined4 *)(lVar53 + lVar44 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x14) =
                           *(undefined4 *)(lVar36 + lVar44 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x18) =
                           *(undefined4 *)(lVar35 + lVar44 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x1c) =
                           *(undefined4 *)(lVar68 + lVar44 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x20) =
                           *(undefined4 *)(lVar60 + lVar44 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x24) =
                           *(undefined4 *)(lVar79 + lVar44 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x28) =
                           *(undefined4 *)(lVar66 + lVar44 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x2c) =
                           *(undefined4 *)(lVar83 + lVar44 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x30) =
                           *(undefined4 *)(lVar52 + lVar44 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x34) =
                           *(undefined4 *)(lVar43 + lVar44 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x38) =
                           *(undefined4 *)(lVar48 + lVar44 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x3c) =
                           *(undefined4 *)(lVar44 + lVar67 + lVar5 + lVar61);
                      lVar28 = lVar28 + 0x40;
                      lVar61 = lVar61 + lVar34;
                    } while ((int)lVar28 != 0x200);
                    uVar18 = uVar18 + 1;
                    lVar19 = lVar19 + 4;
                    puVar59 = (undefined4 *)((long)puVar29 + lVar28);
                  } while (uVar18 != uVar58);
                  puVar59 = (undefined4 *)((long)puVar29 + lVar28);
                }
                local_368 = uVar42 + 8;
                lVar19 = uVar42 + 0xf;
                local_2d0 = local_2d0 + lVar41 * 0x20;
                uVar42 = local_368;
              } while (lVar19 < lVar72);
            }
            if ((int)((uint)local_368 | 3) < (int)num_input) {
              lVar44 = lVar34 * (local_368 & 0xffffffff);
              local_2d0 = 0;
              uVar42 = local_368 & 0xffffffff;
              do {
                if (0 < (int)uVar82) {
                  uVar18 = 0;
                  lVar19 = local_2d0;
                  do {
                    puVar29 = puVar59;
                    lVar28 = 0;
                    lVar61 = lVar19;
                    do {
                      *(undefined4 *)((long)puVar29 + lVar28) =
                           *(undefined4 *)(lVar44 + lVar27 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 4) =
                           *(undefined4 *)(lVar40 + lVar44 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 8) =
                           *(undefined4 *)(lVar44 + lVar70 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0xc) =
                           *(undefined4 *)(lVar44 + lVar63 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x10) =
                           *(undefined4 *)(lVar44 + lVar53 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x14) =
                           *(undefined4 *)(lVar44 + lVar36 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x18) =
                           *(undefined4 *)(lVar44 + lVar35 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x1c) =
                           *(undefined4 *)(lVar68 + lVar44 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x20) =
                           *(undefined4 *)(lVar44 + lVar60 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x24) =
                           *(undefined4 *)(lVar44 + lVar79 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x28) =
                           *(undefined4 *)(lVar66 + lVar44 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x2c) =
                           *(undefined4 *)(lVar44 + lVar83 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x30) =
                           *(undefined4 *)(lVar52 + lVar44 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x34) =
                           *(undefined4 *)(lVar43 + lVar44 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x38) =
                           *(undefined4 *)(lVar44 + lVar48 + lVar5 + lVar61);
                      *(undefined4 *)((long)puVar29 + lVar28 + 0x3c) =
                           *(undefined4 *)(lVar44 + lVar67 + lVar5 + lVar61);
                      lVar28 = lVar28 + 0x40;
                      lVar61 = lVar61 + lVar34;
                    } while ((int)lVar28 != 0x100);
                    uVar18 = uVar18 + 1;
                    lVar19 = lVar19 + 4;
                    puVar59 = (undefined4 *)((long)puVar29 + lVar28);
                  } while (uVar18 != uVar58);
                  puVar59 = (undefined4 *)((long)puVar29 + lVar28);
                }
                local_368 = uVar42 + 4;
                lVar19 = uVar42 + 7;
                local_2d0 = local_2d0 + local_130;
                uVar42 = local_368;
              } while (lVar19 < lVar72);
            }
            uVar32 = (uint)local_368;
            if ((int)(uVar32 | 1) < (int)num_input) {
              lVar19 = lVar34 * (int)uVar32;
              lVar44 = 0;
              uVar42 = (long)(int)uVar32;
              do {
                if (0 < (int)uVar82) {
                  uVar18 = 0;
                  lVar61 = lVar44;
                  do {
                    lVar28 = lVar61;
                    bVar10 = true;
                    do {
                      bVar11 = bVar10;
                      *puVar59 = *(undefined4 *)(lVar19 + lVar27 + lVar5 + lVar28);
                      puVar59[1] = *(undefined4 *)(lVar40 + lVar19 + lVar5 + lVar28);
                      puVar59[2] = *(undefined4 *)(lVar70 + lVar19 + lVar5 + lVar28);
                      puVar59[3] = *(undefined4 *)(lVar63 + lVar19 + lVar5 + lVar28);
                      puVar59[4] = *(undefined4 *)(lVar53 + lVar19 + lVar5 + lVar28);
                      puVar59[5] = *(undefined4 *)(lVar36 + lVar19 + lVar5 + lVar28);
                      puVar59[6] = *(undefined4 *)(lVar35 + lVar19 + lVar5 + lVar28);
                      puVar59[7] = *(undefined4 *)(lVar68 + lVar19 + lVar5 + lVar28);
                      puVar59[8] = *(undefined4 *)(lVar60 + lVar19 + lVar5 + lVar28);
                      puVar59[9] = *(undefined4 *)(lVar19 + lVar79 + lVar5 + lVar28);
                      puVar59[10] = *(undefined4 *)(lVar66 + lVar19 + lVar5 + lVar28);
                      puVar59[0xb] = *(undefined4 *)(lVar19 + lVar83 + lVar5 + lVar28);
                      puVar59[0xc] = *(undefined4 *)(lVar19 + lVar52 + lVar5 + lVar28);
                      puVar59[0xd] = *(undefined4 *)(lVar43 + lVar19 + lVar5 + lVar28);
                      puVar59[0xe] = *(undefined4 *)(lVar19 + lVar48 + lVar5 + lVar28);
                      puVar59[0xf] = *(undefined4 *)(lVar19 + lVar67 + lVar5 + lVar28);
                      puVar59 = puVar59 + 0x10;
                      lVar28 = lVar28 + lVar34;
                      bVar10 = false;
                    } while (bVar11);
                    uVar18 = uVar18 + 1;
                    lVar61 = lVar61 + 4;
                  } while (uVar18 != uVar58);
                }
                local_368 = uVar42 + 2;
                lVar61 = uVar42 + 3;
                lVar44 = lVar44 + lVar41 * 8;
                uVar42 = local_368;
              } while (lVar61 < lVar72);
            }
            if ((int)local_368 < (int)num_input) {
              local_330 = (long)(int)local_368;
              lVar44 = lVar34 * local_330;
              local_2a0 = lVar67 + lVar44 + lVar5;
              local_2d8 = lVar48 + lVar44 + lVar5;
              local_2e8 = lVar43 + lVar44 + lVar5;
              local_2e0 = lVar52 + lVar44 + lVar5;
              lVar48 = lVar83 + lVar44 + lVar5;
              local_2a8 = lVar66 + lVar44 + lVar5;
              lVar52 = lVar79 + lVar44 + lVar5;
              lVar66 = lVar60 + lVar44 + lVar5;
              lVar43 = lVar68 + lVar44 + lVar5;
              lVar35 = lVar35 + lVar44 + lVar5;
              local_278 = lVar36 + lVar44 + lVar5;
              local_280 = lVar53 + lVar44 + lVar5;
              local_328 = lVar63 + lVar44 + lVar5;
              local_320 = lVar70 + lVar44 + lVar5;
              lVar67 = lVar40 + lVar44 + lVar5;
              lVar60 = lVar44 + lVar27 + lVar5;
              do {
                if (0 < (int)uVar82) {
                  lVar27 = 0;
                  do {
                    *puVar59 = *(undefined4 *)(lVar60 + lVar27);
                    puVar59[1] = *(undefined4 *)(lVar67 + lVar27);
                    puVar59[2] = *(undefined4 *)(local_320 + lVar27);
                    puVar59[3] = *(undefined4 *)(local_328 + lVar27);
                    puVar59[4] = *(undefined4 *)(local_280 + lVar27);
                    puVar59[5] = *(undefined4 *)(local_278 + lVar27);
                    puVar59[6] = *(undefined4 *)(lVar35 + lVar27);
                    puVar59[7] = *(undefined4 *)(lVar43 + lVar27);
                    puVar59[8] = *(undefined4 *)(lVar66 + lVar27);
                    puVar59[9] = *(undefined4 *)(lVar52 + lVar27);
                    puVar59[10] = *(undefined4 *)(local_2a8 + lVar27);
                    puVar59[0xb] = *(undefined4 *)(lVar48 + lVar27);
                    puVar59[0xc] = *(undefined4 *)(local_2e0 + lVar27);
                    puVar59[0xd] = *(undefined4 *)(local_2e8 + lVar27);
                    puVar59[0xe] = *(undefined4 *)(local_2d8 + lVar27);
                    puVar59[0xf] = *(undefined4 *)(local_2a0 + lVar27);
                    puVar59 = puVar59 + 0x10;
                    lVar27 = lVar27 + 4;
                  } while (uVar58 * 4 != lVar27);
                }
                local_330 = local_330 + 1;
                local_2a0 = local_2a0 + lVar34;
                local_2d8 = local_2d8 + lVar34;
                local_2e8 = local_2e8 + lVar34;
                local_2e0 = local_2e0 + lVar34;
                lVar48 = lVar48 + lVar34;
                local_2a8 = local_2a8 + lVar34;
                lVar52 = lVar52 + lVar34;
                lVar66 = lVar66 + lVar34;
                lVar43 = lVar43 + lVar34;
                lVar35 = lVar35 + lVar34;
                local_278 = local_278 + lVar34;
                local_280 = local_280 + lVar34;
                local_328 = local_328 + lVar34;
                local_320 = local_320 + lVar34;
                lVar67 = lVar67 + lVar34;
                lVar60 = lVar60 + lVar34;
              } while (local_330 != lVar72);
            }
            uVar42 = uVar80 + 0x10;
            uVar18 = uVar80 + 0x1f;
            local_138 = (ulong)(uint)(iVar25 + iVar15);
            iVar33 = iVar33 + iVar15;
            iVar51 = iVar51 + iVar15;
            iVar31 = iVar31 + iVar15;
            iVar57 = iVar57 + iVar15;
            iVar23 = iVar23 + iVar15;
            iVar62 = iVar62 + iVar15;
            iVar74 = iVar74 + iVar15;
            iVar69 = iVar69 + iVar15;
            iVar46 = iVar46 + iVar15;
            iVar64 = iVar64 + iVar15;
            iVar75 = iVar75 + iVar15;
            iVar13 = iVar13 + iVar15;
            local_b0 = local_b0 + iVar15;
            local_150 = CONCAT44(local_150._4_4_,(int)local_150 + iVar15);
            iVar14 = iVar14 + iVar15;
            uVar80 = uVar42;
          } while (uVar18 < uVar81);
        }
        uVar32 = (uint)uVar42;
        if ((int)(uVar32 | 7) < (int)uVar81) {
          lVar5 = *(long *)(local_148 + 0x160);
          sVar3 = (this->weight_data_tm).elemsize;
          sVar4 = (this->weight_data_tm).cstep;
          pvVar6 = (this->weight_data_tm).data;
          iVar62 = uVar82 * num_input;
          iVar46 = (uVar32 | 7) * iVar62;
          iVar31 = iVar62 * 8;
          iVar64 = (uVar32 + 6) * iVar62;
          iVar14 = (uVar32 + 5) * iVar62;
          iVar51 = (uVar32 + 4) * iVar62;
          iVar23 = (uVar32 + 3) * iVar62;
          iVar13 = (uVar32 + 2) * iVar62;
          iVar74 = (uVar32 + 1) * iVar62;
          iVar62 = iVar62 * uVar32;
          lVar34 = lVar41 * 4;
          uVar80 = uVar42 & 0xffffffff;
          do {
            puVar59 = (undefined4 *)
                      ((ulong)(((uint)(uVar80 >> 4) & 0xfffffff) +
                              (uint)(((uint)uVar80 >> 3 & 1) != 0)) * sVar3 * sVar4 + (long)pvVar6);
            if ((int)num_input < 0x10) {
              uVar42 = 0;
            }
            else {
              lVar67 = 0;
              uVar18 = 0;
              do {
                if (0 < (int)uVar82) {
                  uVar42 = 0;
                  lVar66 = lVar67;
                  do {
                    puVar29 = puVar59;
                    lVar35 = 0;
                    lVar60 = lVar66;
                    do {
                      *(undefined4 *)((long)puVar29 + lVar35) =
                           *(undefined4 *)(lVar5 + (long)iVar62 * 4 + lVar60);
                      *(undefined4 *)((long)puVar29 + lVar35 + 4) =
                           *(undefined4 *)(lVar5 + (long)iVar74 * 4 + lVar60);
                      *(undefined4 *)((long)puVar29 + lVar35 + 8) =
                           *(undefined4 *)(lVar5 + (long)iVar13 * 4 + lVar60);
                      *(undefined4 *)((long)puVar29 + lVar35 + 0xc) =
                           *(undefined4 *)(lVar5 + (long)iVar23 * 4 + lVar60);
                      *(undefined4 *)((long)puVar29 + lVar35 + 0x10) =
                           *(undefined4 *)(lVar5 + (long)iVar51 * 4 + lVar60);
                      *(undefined4 *)((long)puVar29 + lVar35 + 0x14) =
                           *(undefined4 *)(lVar5 + (long)iVar14 * 4 + lVar60);
                      *(undefined4 *)((long)puVar29 + lVar35 + 0x18) =
                           *(undefined4 *)(lVar5 + (long)iVar64 * 4 + lVar60);
                      *(undefined4 *)((long)puVar29 + lVar35 + 0x1c) =
                           *(undefined4 *)(lVar5 + (long)iVar46 * 4 + lVar60);
                      lVar35 = lVar35 + 0x20;
                      lVar60 = lVar60 + lVar34;
                    } while ((int)lVar35 != 0x200);
                    uVar42 = uVar42 + 1;
                    lVar66 = lVar66 + 4;
                    puVar59 = (undefined4 *)((long)puVar29 + lVar35);
                  } while (uVar42 != uVar58);
                  puVar59 = (undefined4 *)((long)puVar29 + lVar35);
                }
                uVar42 = uVar18 + 0x10;
                lVar66 = uVar18 + 0x1f;
                lVar67 = lVar67 + uVar58 * 0x40;
                uVar18 = uVar42;
              } while (lVar66 < lVar72);
            }
            lVar40 = (long)iVar46 * 4;
            lVar35 = (long)iVar64 * 4;
            lVar27 = (long)iVar14 * 4;
            lVar36 = (long)iVar51 * 4;
            lVar66 = (long)iVar23 * 4;
            lVar60 = (long)iVar13 * 4;
            lVar67 = (long)iVar74 * 4;
            lVar43 = (long)iVar62 * 4;
            if ((int)((uint)uVar42 | 7) < (int)num_input) {
              lVar52 = lVar34 * (uVar42 & 0xffffffff);
              lVar48 = 0;
              uVar18 = uVar42 & 0xffffffff;
              do {
                if (0 < (int)uVar82) {
                  uVar42 = 0;
                  lVar53 = lVar48;
                  do {
                    puVar29 = puVar59;
                    lVar68 = 0;
                    lVar63 = lVar53;
                    do {
                      *(undefined4 *)((long)puVar29 + lVar68) =
                           *(undefined4 *)(lVar52 + lVar43 + lVar5 + lVar63);
                      *(undefined4 *)((long)puVar29 + lVar68 + 4) =
                           *(undefined4 *)(lVar67 + lVar52 + lVar5 + lVar63);
                      *(undefined4 *)((long)puVar29 + lVar68 + 8) =
                           *(undefined4 *)(lVar60 + lVar52 + lVar5 + lVar63);
                      *(undefined4 *)((long)puVar29 + lVar68 + 0xc) =
                           *(undefined4 *)(lVar52 + lVar66 + lVar5 + lVar63);
                      *(undefined4 *)((long)puVar29 + lVar68 + 0x10) =
                           *(undefined4 *)(lVar52 + lVar36 + lVar5 + lVar63);
                      *(undefined4 *)((long)puVar29 + lVar68 + 0x14) =
                           *(undefined4 *)(lVar52 + lVar27 + lVar5 + lVar63);
                      *(undefined4 *)((long)puVar29 + lVar68 + 0x18) =
                           *(undefined4 *)(lVar52 + lVar35 + lVar5 + lVar63);
                      *(undefined4 *)((long)puVar29 + lVar68 + 0x1c) =
                           *(undefined4 *)(lVar52 + lVar40 + lVar5 + lVar63);
                      lVar68 = lVar68 + 0x20;
                      lVar63 = lVar63 + lVar34;
                    } while ((int)lVar68 != 0x100);
                    uVar42 = uVar42 + 1;
                    lVar53 = lVar53 + 4;
                    puVar59 = (undefined4 *)((long)puVar29 + lVar68);
                  } while (uVar42 != uVar58);
                  puVar59 = (undefined4 *)((long)puVar29 + lVar68);
                }
                uVar42 = uVar18 + 8;
                lVar53 = uVar18 + 0xf;
                lVar48 = lVar48 + lVar41 * 0x20;
                uVar18 = uVar42;
              } while (lVar53 < lVar72);
            }
            if ((int)((uint)uVar42 | 3) < (int)num_input) {
              lVar52 = lVar34 * (uVar42 & 0xffffffff);
              lVar48 = 0;
              uVar18 = uVar42 & 0xffffffff;
              do {
                if (0 < (int)uVar82) {
                  uVar42 = 0;
                  lVar53 = lVar48;
                  do {
                    puVar29 = puVar59;
                    lVar68 = 0;
                    lVar63 = lVar53;
                    do {
                      *(undefined4 *)((long)puVar29 + lVar68) =
                           *(undefined4 *)(lVar52 + lVar43 + lVar5 + lVar63);
                      *(undefined4 *)((long)puVar29 + lVar68 + 4) =
                           *(undefined4 *)(lVar67 + lVar52 + lVar5 + lVar63);
                      *(undefined4 *)((long)puVar29 + lVar68 + 8) =
                           *(undefined4 *)(lVar52 + lVar60 + lVar5 + lVar63);
                      *(undefined4 *)((long)puVar29 + lVar68 + 0xc) =
                           *(undefined4 *)(lVar52 + lVar66 + lVar5 + lVar63);
                      *(undefined4 *)((long)puVar29 + lVar68 + 0x10) =
                           *(undefined4 *)(lVar52 + lVar36 + lVar5 + lVar63);
                      *(undefined4 *)((long)puVar29 + lVar68 + 0x14) =
                           *(undefined4 *)(lVar52 + lVar27 + lVar5 + lVar63);
                      *(undefined4 *)((long)puVar29 + lVar68 + 0x18) =
                           *(undefined4 *)(lVar52 + lVar35 + lVar5 + lVar63);
                      *(undefined4 *)((long)puVar29 + lVar68 + 0x1c) =
                           *(undefined4 *)(lVar52 + lVar40 + lVar5 + lVar63);
                      lVar68 = lVar68 + 0x20;
                      lVar63 = lVar63 + lVar34;
                    } while ((int)lVar68 != 0x80);
                    uVar42 = uVar42 + 1;
                    lVar53 = lVar53 + 4;
                    puVar59 = (undefined4 *)((long)puVar29 + lVar68);
                  } while (uVar42 != uVar58);
                  puVar59 = (undefined4 *)((long)puVar29 + lVar68);
                }
                uVar42 = uVar18 + 4;
                lVar53 = uVar18 + 7;
                lVar48 = lVar48 + lVar41 * 0x10;
                uVar18 = uVar42;
              } while (lVar53 < lVar72);
            }
            uVar32 = (uint)uVar42;
            if ((int)(uVar32 | 1) < (int)num_input) {
              lVar52 = lVar34 * (int)uVar32;
              lVar48 = 0;
              uVar18 = (long)(int)uVar32;
              do {
                if (0 < (int)uVar82) {
                  uVar42 = 0;
                  lVar53 = lVar48;
                  do {
                    lVar63 = lVar53;
                    bVar10 = true;
                    do {
                      bVar11 = bVar10;
                      *puVar59 = *(undefined4 *)(lVar52 + lVar43 + lVar5 + lVar63);
                      puVar59[1] = *(undefined4 *)(lVar67 + lVar52 + lVar5 + lVar63);
                      puVar59[2] = *(undefined4 *)(lVar52 + lVar60 + lVar5 + lVar63);
                      puVar59[3] = *(undefined4 *)(lVar52 + lVar66 + lVar5 + lVar63);
                      puVar59[4] = *(undefined4 *)(lVar52 + lVar36 + lVar5 + lVar63);
                      puVar59[5] = *(undefined4 *)(lVar52 + lVar27 + lVar5 + lVar63);
                      puVar59[6] = *(undefined4 *)(lVar52 + lVar35 + lVar5 + lVar63);
                      puVar59[7] = *(undefined4 *)(lVar52 + lVar40 + lVar5 + lVar63);
                      puVar59 = puVar59 + 8;
                      lVar63 = lVar63 + lVar34;
                      bVar10 = false;
                    } while (bVar11);
                    uVar42 = uVar42 + 1;
                    lVar53 = lVar53 + 4;
                  } while (uVar42 != uVar58);
                }
                uVar42 = uVar18 + 2;
                lVar53 = uVar18 + 3;
                lVar48 = lVar48 + lVar41 * 8;
                uVar18 = uVar42;
              } while (lVar53 < lVar72);
            }
            if ((int)uVar42 < (int)num_input) {
              lVar53 = (long)(int)uVar42;
              lVar48 = lVar34 * lVar53;
              lVar52 = lVar40 + lVar48 + lVar5;
              lVar40 = lVar35 + lVar48 + lVar5;
              lVar27 = lVar27 + lVar48 + lVar5;
              lVar36 = lVar36 + lVar48 + lVar5;
              lVar35 = lVar66 + lVar48 + lVar5;
              lVar66 = lVar60 + lVar48 + lVar5;
              lVar60 = lVar67 + lVar48 + lVar5;
              lVar67 = lVar48 + lVar43 + lVar5;
              do {
                if (0 < (int)uVar82) {
                  lVar43 = 0;
                  puVar29 = puVar59;
                  do {
                    puVar56 = puVar29;
                    puVar29 = puVar59 + lVar43 * 2;
                    *puVar29 = *(undefined4 *)(lVar67 + lVar43);
                    puVar29[1] = *(undefined4 *)(lVar60 + lVar43);
                    puVar29[2] = *(undefined4 *)(lVar66 + lVar43);
                    puVar29[3] = *(undefined4 *)(lVar35 + lVar43);
                    puVar29[4] = *(undefined4 *)(lVar36 + lVar43);
                    puVar29[5] = *(undefined4 *)(lVar27 + lVar43);
                    puVar29[6] = *(undefined4 *)(lVar40 + lVar43);
                    puVar29[7] = *(undefined4 *)(lVar52 + lVar43);
                    lVar43 = lVar43 + 4;
                    puVar29 = puVar29 + 8;
                  } while (uVar58 * 4 != lVar43);
                  puVar59 = puVar56 + 8;
                }
                lVar53 = lVar53 + 1;
                lVar52 = lVar52 + lVar34;
                lVar40 = lVar40 + lVar34;
                lVar27 = lVar27 + lVar34;
                lVar36 = lVar36 + lVar34;
                lVar35 = lVar35 + lVar34;
                lVar66 = lVar66 + lVar34;
                lVar60 = lVar60 + lVar34;
                lVar67 = lVar67 + lVar34;
              } while (lVar53 != lVar72);
            }
            uVar42 = uVar80 + 8;
            lVar67 = uVar80 + 0xf;
            iVar46 = iVar46 + iVar31;
            iVar64 = iVar64 + iVar31;
            iVar14 = iVar14 + iVar31;
            iVar51 = iVar51 + iVar31;
            iVar23 = iVar23 + iVar31;
            iVar13 = iVar13 + iVar31;
            iVar74 = iVar74 + iVar31;
            iVar62 = iVar62 + iVar31;
            uVar80 = uVar42;
          } while (lVar67 < (long)uVar47);
        }
        uVar32 = (uint)uVar42;
        if ((int)(uVar32 | 3) < (int)uVar81) {
          lVar67 = *(long *)(local_148 + 0x160);
          sVar3 = (this->weight_data_tm).elemsize;
          sVar4 = (this->weight_data_tm).cstep;
          pvVar6 = (this->weight_data_tm).data;
          iVar74 = uVar82 * num_input;
          iVar23 = (uVar32 | 3) * iVar74;
          iVar31 = iVar74 * 4;
          lVar66 = uVar58 * 0x40;
          lVar34 = lVar41 * 4;
          iVar46 = (uVar32 + 2) * iVar74;
          iVar62 = (uVar32 + 1) * iVar74;
          iVar74 = iVar74 * uVar32;
          lVar5 = lVar41 * 8;
          uVar80 = uVar42 & 0xffffffff;
          do {
            puVar59 = (undefined4 *)
                      ((ulong)(((uint)(uVar80 >> 3) & 1) + ((uint)(uVar80 >> 4) & 0xfffffff) +
                              (uint)(((uint)uVar80 >> 2 & 1) != 0)) * sVar3 * sVar4 + (long)pvVar6);
            if ((int)num_input < 0x10) {
              uVar42 = 0;
            }
            else {
              lVar60 = lVar67 + (long)iVar23 * 4;
              lVar35 = lVar67 + (long)iVar46 * 4;
              lVar27 = lVar67 + (long)iVar62 * 4;
              lVar36 = lVar67 + (long)iVar74 * 4;
              uVar18 = 0;
              do {
                if (0 < (int)uVar82) {
                  uVar42 = 0;
                  lVar40 = lVar36;
                  lVar43 = lVar27;
                  lVar48 = lVar35;
                  lVar52 = lVar60;
                  do {
                    puVar29 = puVar59;
                    lVar63 = 0;
                    lVar53 = 0;
                    do {
                      *(undefined4 *)((long)puVar29 + lVar53) = *(undefined4 *)(lVar40 + lVar63);
                      *(undefined4 *)((long)puVar29 + lVar53 + 4) = *(undefined4 *)(lVar43 + lVar63)
                      ;
                      *(undefined4 *)((long)puVar29 + lVar53 + 8) = *(undefined4 *)(lVar48 + lVar63)
                      ;
                      *(undefined4 *)((long)puVar29 + lVar53 + 0xc) =
                           *(undefined4 *)(lVar52 + lVar63);
                      lVar53 = lVar53 + 0x10;
                      lVar63 = lVar63 + lVar34;
                    } while ((int)lVar53 != 0x100);
                    uVar42 = uVar42 + 1;
                    lVar52 = lVar52 + 4;
                    lVar48 = lVar48 + 4;
                    lVar43 = lVar43 + 4;
                    lVar40 = lVar40 + 4;
                    puVar59 = (undefined4 *)((long)puVar29 + lVar53);
                  } while (uVar42 != uVar58);
                  puVar59 = (undefined4 *)((long)puVar29 + lVar53);
                }
                uVar42 = uVar18 + 0x10;
                lVar40 = uVar18 + 0x1f;
                lVar60 = lVar60 + lVar66;
                lVar35 = lVar35 + lVar66;
                lVar27 = lVar27 + lVar66;
                lVar36 = lVar36 + lVar66;
                uVar18 = uVar42;
              } while (lVar40 < lVar72);
            }
            lVar27 = (long)iVar23 * 4;
            lVar36 = (long)iVar46 * 4;
            lVar60 = (long)iVar62 * 4;
            lVar35 = (long)iVar74 * 4;
            if ((int)((uint)uVar42 | 7) < (int)num_input) {
              lVar40 = lVar34 * (uVar42 & 0xffffffff);
              lVar43 = 0;
              uVar18 = uVar42 & 0xffffffff;
              do {
                if (0 < (int)uVar82) {
                  uVar42 = 0;
                  lVar48 = lVar43;
                  do {
                    puVar29 = puVar59;
                    lVar53 = 0;
                    lVar52 = lVar48;
                    do {
                      *(undefined4 *)((long)puVar29 + lVar53) =
                           *(undefined4 *)(lVar40 + lVar35 + lVar67 + lVar52);
                      *(undefined4 *)((long)puVar29 + lVar53 + 4) =
                           *(undefined4 *)(lVar40 + lVar60 + lVar67 + lVar52);
                      *(undefined4 *)((long)puVar29 + lVar53 + 8) =
                           *(undefined4 *)(lVar36 + lVar40 + lVar67 + lVar52);
                      *(undefined4 *)((long)puVar29 + lVar53 + 0xc) =
                           *(undefined4 *)(lVar40 + lVar27 + lVar67 + lVar52);
                      lVar53 = lVar53 + 0x10;
                      lVar52 = lVar52 + lVar34;
                    } while ((int)lVar53 != 0x80);
                    uVar42 = uVar42 + 1;
                    lVar48 = lVar48 + 4;
                    puVar59 = (undefined4 *)((long)puVar29 + lVar53);
                  } while (uVar42 != uVar58);
                  puVar59 = (undefined4 *)((long)puVar29 + lVar53);
                }
                uVar42 = uVar18 + 8;
                lVar48 = uVar18 + 0xf;
                lVar43 = lVar43 + lVar41 * 0x20;
                uVar18 = uVar42;
              } while (lVar48 < lVar72);
            }
            if ((int)((uint)uVar42 | 3) < (int)num_input) {
              lVar40 = lVar34 * (uVar42 & 0xffffffff);
              lVar43 = 0;
              uVar18 = uVar42 & 0xffffffff;
              do {
                if (0 < (int)uVar82) {
                  uVar42 = 0;
                  lVar48 = lVar43;
                  do {
                    puVar29 = puVar59;
                    lVar53 = 0;
                    lVar52 = lVar48;
                    do {
                      *(undefined4 *)((long)puVar29 + lVar53) =
                           *(undefined4 *)(lVar40 + lVar35 + lVar67 + lVar52);
                      *(undefined4 *)((long)puVar29 + lVar53 + 4) =
                           *(undefined4 *)(lVar40 + lVar60 + lVar67 + lVar52);
                      *(undefined4 *)((long)puVar29 + lVar53 + 8) =
                           *(undefined4 *)(lVar36 + lVar40 + lVar67 + lVar52);
                      *(undefined4 *)((long)puVar29 + lVar53 + 0xc) =
                           *(undefined4 *)(lVar40 + lVar27 + lVar67 + lVar52);
                      lVar53 = lVar53 + 0x10;
                      lVar52 = lVar52 + lVar34;
                    } while ((int)lVar53 != 0x40);
                    uVar42 = uVar42 + 1;
                    lVar48 = lVar48 + 4;
                    puVar59 = (undefined4 *)((long)puVar29 + lVar53);
                  } while (uVar42 != uVar58);
                  puVar59 = (undefined4 *)((long)puVar29 + lVar53);
                }
                uVar42 = uVar18 + 4;
                lVar48 = uVar18 + 7;
                lVar43 = lVar43 + lVar41 * 0x10;
                uVar18 = uVar42;
              } while (lVar48 < lVar72);
            }
            uVar32 = (uint)uVar42;
            if ((int)(uVar32 | 1) < (int)num_input) {
              lVar40 = lVar34 * (int)uVar32;
              lVar43 = lVar27 + lVar40 + lVar67;
              lVar48 = lVar36 + lVar40 + lVar67;
              lVar52 = lVar60 + lVar40 + lVar67;
              lVar40 = lVar40 + lVar35 + lVar67;
              uVar18 = (long)(int)uVar32;
              do {
                if (0 < (int)uVar82) {
                  uVar42 = 0;
                  lVar53 = lVar48;
                  lVar63 = lVar43;
                  lVar68 = lVar52;
                  lVar70 = lVar40;
                  do {
                    lVar79 = 0;
                    bVar10 = true;
                    do {
                      bVar11 = bVar10;
                      *puVar59 = *(undefined4 *)(lVar70 + lVar79);
                      puVar59[1] = *(undefined4 *)(lVar68 + lVar79);
                      puVar59[2] = *(undefined4 *)(lVar53 + lVar79);
                      puVar59[3] = *(undefined4 *)(lVar63 + lVar79);
                      puVar59 = puVar59 + 4;
                      lVar79 = lVar79 + lVar34;
                      bVar10 = false;
                    } while (bVar11);
                    uVar42 = uVar42 + 1;
                    lVar63 = lVar63 + 4;
                    lVar53 = lVar53 + 4;
                    lVar68 = lVar68 + 4;
                    lVar70 = lVar70 + 4;
                  } while (uVar42 != uVar58);
                }
                uVar42 = uVar18 + 2;
                lVar53 = uVar18 + 3;
                lVar43 = lVar43 + lVar5;
                lVar48 = lVar48 + lVar5;
                lVar52 = lVar52 + lVar5;
                lVar40 = lVar40 + lVar5;
                uVar18 = uVar42;
              } while (lVar53 < lVar72);
            }
            if ((int)uVar42 < (int)num_input) {
              lVar40 = (long)(int)uVar42;
              lVar43 = lVar34 * lVar40;
              lVar27 = lVar27 + lVar43 + lVar67;
              lVar36 = lVar36 + lVar43 + lVar67;
              lVar60 = lVar60 + lVar43 + lVar67;
              lVar35 = lVar43 + lVar35 + lVar67;
              do {
                if (0 < (int)uVar82) {
                  lVar43 = 0;
                  puVar29 = puVar59;
                  do {
                    puVar56 = puVar29;
                    puVar29 = puVar59 + lVar43 + 4;
                    puVar29[-4] = *(undefined4 *)(lVar35 + lVar43);
                    puVar29[-3] = *(undefined4 *)(lVar60 + lVar43);
                    puVar29[-2] = *(undefined4 *)(lVar36 + lVar43);
                    puVar29[-1] = *(undefined4 *)(lVar27 + lVar43);
                    lVar43 = lVar43 + 4;
                  } while (uVar58 * 4 != lVar43);
                  puVar59 = puVar56 + 4;
                }
                lVar40 = lVar40 + 1;
                lVar27 = lVar27 + lVar34;
                lVar36 = lVar36 + lVar34;
                lVar60 = lVar60 + lVar34;
                lVar35 = lVar35 + lVar34;
              } while (lVar40 != lVar72);
            }
            uVar42 = uVar80 + 4;
            lVar60 = uVar80 + 7;
            iVar23 = iVar23 + iVar31;
            iVar46 = iVar46 + iVar31;
            iVar62 = iVar62 + iVar31;
            iVar74 = iVar74 + iVar31;
            uVar80 = uVar42;
          } while (lVar60 < (long)uVar47);
        }
        uVar32 = (uint)uVar42;
        if ((int)(uVar32 | 1) < (int)uVar81) {
          sVar3 = (this->weight_data_tm).elemsize;
          sVar4 = (this->weight_data_tm).cstep;
          iVar23 = uVar82 * num_input;
          iVar74 = (uVar32 | 1) * iVar23;
          iVar31 = iVar23 * uVar32;
          lVar68 = *(long *)(local_148 + 0x160);
          lVar34 = lVar68 + (long)(int)(uVar82 * 0xf) * 4;
          lVar83 = uVar58 * 0x40;
          lVar5 = lVar68 + (long)(int)(uVar82 * 0xe) * 4;
          lVar67 = lVar68 + (long)(int)(uVar82 * 0xd) * 4;
          lVar66 = lVar68 + (long)(int)(uVar82 * 0xc) * 4;
          lVar60 = lVar68 + (long)(int)(uVar82 * 0xb) * 4;
          lVar35 = lVar68 + (long)(int)(uVar82 * 10) * 4;
          lVar27 = lVar68 + (long)(int)(uVar82 * 9) * 4;
          lVar36 = lVar68 + (long)(int)(uVar82 * 8) * 4;
          local_150 = lVar68 + (long)(int)(uVar82 * 7) * 4;
          lVar40 = lVar68 + (long)(int)(uVar82 * 6) * 4;
          lVar43 = lVar68 + (long)(int)(uVar82 * 5) * 4;
          local_140 = lVar68 + (long)(int)(uVar82 * 4) * 4;
          lVar48 = lVar68 + (long)(int)(uVar82 * 3) * 4;
          lVar52 = lVar68 + (long)(int)(uVar82 * 2) * 4;
          lVar70 = lVar41 * 0x20;
          lVar79 = lVar41 * 0x10;
          pvVar6 = (this->weight_data_tm).data;
          local_130 = uVar58 * 4;
          lVar63 = lVar41 * 4;
          lVar53 = lVar68 + lVar41 * 4;
          uVar80 = (long)(int)uVar32;
          do {
            local_138 = CONCAT44(local_138._4_4_,iVar74);
            lVar19 = (long)iVar74;
            uVar81 = (uint)uVar80;
            lVar44 = (long)iVar31;
            puVar59 = (undefined4 *)
                      ((ulong)((uVar81 >> 2 & 1) +
                               ((uint)(uVar80 >> 4) & 0xfffffff) + (uint)((uVar81 >> 3 & 1) != 0) +
                              (uint)((uVar81 >> 1 & 1) != 0)) * sVar3 * sVar4 + (long)pvVar6);
            if ((int)num_input < 0x10) {
              uVar42 = 0;
            }
            else {
              lVar61 = lVar34 + lVar19 * 4;
              lVar28 = lVar5 + lVar19 * 4;
              lVar73 = lVar67 + lVar19 * 4;
              lVar71 = lVar66 + lVar19 * 4;
              lVar85 = lVar60 + lVar19 * 4;
              lVar45 = lVar35 + lVar19 * 4;
              lVar38 = lVar27 + lVar19 * 4;
              lVar37 = lVar36 + lVar19 * 4;
              lVar21 = local_150 + lVar19 * 4;
              lVar55 = lVar40 + lVar19 * 4;
              lVar49 = lVar43 + lVar19 * 4;
              lVar54 = local_140 + lVar19 * 4;
              local_2d0 = lVar48 + lVar19 * 4;
              local_2e8 = lVar52 + lVar19 * 4;
              local_2e0 = lVar53 + lVar19 * 4;
              local_2d8 = lVar68 + lVar19 * 4;
              local_2a0 = lVar34 + lVar44 * 4;
              local_2a8 = lVar5 + lVar44 * 4;
              local_278 = lVar67 + lVar44 * 4;
              local_280 = lVar66 + lVar44 * 4;
              local_288 = lVar60 + lVar44 * 4;
              local_128 = lVar35 + lVar44 * 4;
              local_2f0 = lVar27 + lVar44 * 4;
              local_2b8 = lVar36 + lVar44 * 4;
              local_2c0 = local_150 + lVar44 * 4;
              local_2c8 = lVar40 + lVar44 * 4;
              local_248 = lVar43 + lVar44 * 4;
              local_240 = local_140 + lVar44 * 4;
              local_258 = lVar48 + lVar44 * 4;
              local_250 = lVar52 + lVar44 * 4;
              local_260 = lVar53 + lVar44 * 4;
              lVar20 = lVar68 + lVar44 * 4;
              local_a8 = 0;
              do {
                if (0 < (int)uVar82) {
                  lVar84 = 0;
                  do {
                    *puVar59 = *(undefined4 *)(lVar20 + lVar84);
                    puVar59[1] = *(undefined4 *)(local_260 + lVar84);
                    puVar59[2] = *(undefined4 *)(local_250 + lVar84);
                    puVar59[3] = *(undefined4 *)(local_258 + lVar84);
                    puVar59[4] = *(undefined4 *)(local_240 + lVar84);
                    puVar59[5] = *(undefined4 *)(local_248 + lVar84);
                    puVar59[6] = *(undefined4 *)(local_2c8 + lVar84);
                    puVar59[7] = *(undefined4 *)(local_2c0 + lVar84);
                    puVar59[8] = *(undefined4 *)(local_2b8 + lVar84);
                    puVar59[9] = *(undefined4 *)(local_2f0 + lVar84);
                    puVar59[10] = *(undefined4 *)(local_128 + lVar84);
                    puVar59[0xb] = *(undefined4 *)(local_288 + lVar84);
                    puVar59[0xc] = *(undefined4 *)(local_280 + lVar84);
                    puVar59[0xd] = *(undefined4 *)(local_278 + lVar84);
                    puVar59[0xe] = *(undefined4 *)(local_2a8 + lVar84);
                    puVar59[0xf] = *(undefined4 *)(local_2a0 + lVar84);
                    puVar59[0x10] = *(undefined4 *)(local_2d8 + lVar84);
                    puVar59[0x11] = *(undefined4 *)(local_2e0 + lVar84);
                    puVar59[0x12] = *(undefined4 *)(local_2e8 + lVar84);
                    puVar59[0x13] = *(undefined4 *)(local_2d0 + lVar84);
                    puVar59[0x14] = *(undefined4 *)(lVar54 + lVar84);
                    puVar59[0x15] = *(undefined4 *)(lVar49 + lVar84);
                    puVar59[0x16] = *(undefined4 *)(lVar55 + lVar84);
                    puVar59[0x17] = *(undefined4 *)(lVar21 + lVar84);
                    puVar59[0x18] = *(undefined4 *)(lVar37 + lVar84);
                    puVar59[0x19] = *(undefined4 *)(lVar38 + lVar84);
                    puVar59[0x1a] = *(undefined4 *)(lVar45 + lVar84);
                    puVar59[0x1b] = *(undefined4 *)(lVar85 + lVar84);
                    puVar59[0x1c] = *(undefined4 *)(lVar71 + lVar84);
                    puVar59[0x1d] = *(undefined4 *)(lVar73 + lVar84);
                    puVar59[0x1e] = *(undefined4 *)(lVar28 + lVar84);
                    puVar59[0x1f] = *(undefined4 *)(lVar61 + lVar84);
                    puVar59 = puVar59 + 0x20;
                    lVar84 = lVar84 + 4;
                  } while (local_130 != lVar84);
                }
                uVar42 = local_a8 + 0x10;
                lVar84 = local_a8 + 0x1f;
                lVar61 = lVar61 + lVar83;
                lVar28 = lVar28 + lVar83;
                lVar73 = lVar73 + lVar83;
                lVar71 = lVar71 + lVar83;
                lVar85 = lVar85 + lVar83;
                lVar45 = lVar45 + lVar83;
                lVar38 = lVar38 + lVar83;
                lVar37 = lVar37 + lVar83;
                lVar21 = lVar21 + lVar83;
                lVar55 = lVar55 + lVar83;
                lVar49 = lVar49 + lVar83;
                lVar54 = lVar54 + lVar83;
                local_2d0 = local_2d0 + lVar83;
                local_2e8 = local_2e8 + lVar83;
                local_2e0 = local_2e0 + lVar83;
                local_2d8 = local_2d8 + lVar83;
                local_2a0 = local_2a0 + lVar83;
                local_2a8 = local_2a8 + lVar83;
                local_278 = local_278 + lVar83;
                local_280 = local_280 + lVar83;
                local_288 = local_288 + lVar83;
                local_128 = local_128 + lVar83;
                local_2f0 = local_2f0 + lVar83;
                local_2b8 = local_2b8 + lVar83;
                local_2c0 = local_2c0 + lVar83;
                local_2c8 = local_2c8 + lVar83;
                local_248 = local_248 + lVar83;
                local_240 = local_240 + lVar83;
                local_258 = local_258 + lVar83;
                local_250 = local_250 + lVar83;
                local_260 = local_260 + lVar83;
                lVar20 = lVar20 + lVar83;
                local_a8 = uVar42;
              } while (lVar84 < lVar72);
            }
            lVar19 = lVar19 * 4;
            lVar44 = lVar44 * 4;
            if ((int)((uint)uVar42 | 7) < (int)num_input) {
              local_318 = uVar42 & 0xffffffff;
              lVar61 = lVar63 * local_318 + lVar19;
              local_340 = local_150 + lVar61;
              local_2f8 = lVar40 + lVar61;
              lVar37 = lVar43 + lVar61;
              local_350 = local_140 + lVar61;
              lVar28 = lVar48 + lVar61;
              lVar73 = lVar52 + lVar61;
              lVar21 = (local_318 * 4 + 4) * lVar41;
              local_358 = lVar19 + lVar68 + lVar21;
              lVar55 = lVar63 * local_318 + lVar44;
              lVar54 = local_150 + lVar55;
              lVar85 = lVar40 + lVar55;
              local_328 = lVar43 + lVar55;
              lVar21 = lVar21 + lVar44 + lVar68;
              local_320 = local_140 + lVar55;
              lVar45 = lVar48 + lVar55;
              lVar38 = lVar52 + lVar55;
              do {
                if (0 < (int)uVar82) {
                  lVar20 = 0;
                  do {
                    *puVar59 = *(undefined4 *)(lVar68 + lVar55 + lVar20);
                    puVar59[1] = *(undefined4 *)(lVar21 + lVar20);
                    puVar59[2] = *(undefined4 *)(lVar38 + lVar20);
                    puVar59[3] = *(undefined4 *)(lVar45 + lVar20);
                    puVar59[4] = *(undefined4 *)(local_320 + lVar20);
                    puVar59[5] = *(undefined4 *)(local_328 + lVar20);
                    puVar59[6] = *(undefined4 *)(lVar85 + lVar20);
                    puVar59[7] = *(undefined4 *)(lVar54 + lVar20);
                    puVar59[8] = *(undefined4 *)(lVar68 + lVar61 + lVar20);
                    puVar59[9] = *(undefined4 *)(local_358 + lVar20);
                    puVar59[10] = *(undefined4 *)(lVar73 + lVar20);
                    puVar59[0xb] = *(undefined4 *)(lVar28 + lVar20);
                    puVar59[0xc] = *(undefined4 *)(local_350 + lVar20);
                    puVar59[0xd] = *(undefined4 *)(lVar37 + lVar20);
                    puVar59[0xe] = *(undefined4 *)(local_2f8 + lVar20);
                    puVar59[0xf] = *(undefined4 *)(local_340 + lVar20);
                    puVar59 = puVar59 + 0x10;
                    lVar20 = lVar20 + 4;
                  } while (local_130 != lVar20);
                }
                uVar42 = local_318 + 8;
                lVar20 = local_318 + 0xf;
                local_340 = local_340 + lVar70;
                local_2f8 = local_2f8 + lVar70;
                lVar37 = lVar37 + lVar70;
                local_350 = local_350 + lVar70;
                lVar28 = lVar28 + lVar70;
                lVar73 = lVar73 + lVar70;
                local_358 = local_358 + lVar70;
                lVar61 = lVar61 + lVar70;
                lVar54 = lVar54 + lVar70;
                lVar85 = lVar85 + lVar70;
                local_328 = local_328 + lVar70;
                local_320 = local_320 + lVar70;
                lVar45 = lVar45 + lVar70;
                lVar38 = lVar38 + lVar70;
                lVar21 = lVar21 + lVar70;
                lVar55 = lVar55 + lVar70;
                local_318 = uVar42;
              } while (lVar20 < lVar72);
            }
            if ((int)((uint)uVar42 | 3) < (int)num_input) {
              uVar18 = uVar42 & 0xffffffff;
              lVar61 = lVar63 * uVar18 + lVar19;
              lVar28 = lVar48 + lVar61;
              lVar73 = lVar61 + lVar52;
              lVar38 = (uVar18 * 4 + 4) * lVar41;
              lVar37 = lVar19 + lVar68 + lVar38;
              lVar61 = lVar61 + lVar68;
              lVar45 = lVar63 * uVar18 + lVar44;
              lVar21 = lVar48 + lVar45;
              lVar38 = lVar38 + lVar44 + lVar68;
              lVar85 = lVar45 + lVar52;
              lVar45 = lVar45 + lVar68;
              do {
                if (0 < (int)uVar82) {
                  lVar55 = 0;
                  puVar29 = puVar59;
                  do {
                    puVar56 = puVar29;
                    puVar29 = puVar59 + lVar55 * 2;
                    *puVar29 = *(undefined4 *)(lVar45 + lVar55);
                    puVar29[1] = *(undefined4 *)(lVar38 + lVar55);
                    puVar29[2] = *(undefined4 *)(lVar85 + lVar55);
                    puVar29[3] = *(undefined4 *)(lVar21 + lVar55);
                    puVar29[4] = *(undefined4 *)(lVar61 + lVar55);
                    puVar29[5] = *(undefined4 *)(lVar37 + lVar55);
                    puVar29[6] = *(undefined4 *)(lVar73 + lVar55);
                    puVar29[7] = *(undefined4 *)(lVar28 + lVar55);
                    lVar55 = lVar55 + 4;
                    puVar29 = puVar29 + 8;
                  } while (local_130 != lVar55);
                  puVar59 = puVar56 + 8;
                }
                uVar42 = uVar18 + 4;
                lVar55 = uVar18 + 7;
                lVar28 = lVar28 + lVar79;
                lVar73 = lVar73 + lVar79;
                lVar37 = lVar37 + lVar79;
                lVar61 = lVar61 + lVar79;
                lVar21 = lVar21 + lVar79;
                lVar85 = lVar85 + lVar79;
                lVar38 = lVar38 + lVar79;
                lVar45 = lVar45 + lVar79;
                uVar18 = uVar42;
              } while (lVar55 < lVar72);
            }
            uVar81 = (uint)uVar42;
            if ((int)(uVar81 | 1) < (int)num_input) {
              lVar61 = lVar63 * (int)uVar81;
              lVar28 = lVar61 + lVar19 + lVar68;
              lVar61 = lVar61 + lVar44 + lVar68;
              uVar18 = (long)(int)uVar81;
              do {
                if (0 < (int)uVar82) {
                  uVar42 = 0;
                  lVar73 = lVar61;
                  lVar85 = lVar28;
                  do {
                    lVar45 = 0;
                    bVar10 = true;
                    do {
                      bVar11 = bVar10;
                      *puVar59 = *(undefined4 *)(lVar73 + lVar45);
                      puVar59[1] = *(undefined4 *)(lVar85 + lVar45);
                      puVar59 = puVar59 + 2;
                      lVar45 = lVar45 + lVar63;
                      bVar10 = false;
                    } while (bVar11);
                    uVar42 = uVar42 + 1;
                    lVar85 = lVar85 + 4;
                    lVar73 = lVar73 + 4;
                  } while (uVar42 != uVar58);
                }
                uVar42 = uVar18 + 2;
                lVar73 = uVar18 + 3;
                lVar28 = lVar28 + lVar41 * 8;
                lVar61 = lVar61 + lVar41 * 8;
                uVar18 = uVar42;
              } while (lVar73 < lVar72);
            }
            if ((int)uVar42 < (int)num_input) {
              lVar61 = (long)(int)uVar42;
              lVar19 = lVar19 + lVar63 * lVar61 + lVar68;
              lVar44 = lVar63 * lVar61 + lVar44 + lVar68;
              do {
                if (0 < (int)uVar82) {
                  uVar42 = 0;
                  do {
                    *puVar59 = *(undefined4 *)(lVar44 + uVar42 * 4);
                    puVar59[1] = *(undefined4 *)(lVar19 + uVar42 * 4);
                    puVar59 = puVar59 + 2;
                    uVar42 = uVar42 + 1;
                  } while (uVar58 != uVar42);
                }
                lVar61 = lVar61 + 1;
                lVar19 = lVar19 + lVar63;
                lVar44 = lVar44 + lVar63;
              } while (lVar61 != lVar72);
            }
            uVar42 = uVar80 + 2;
            lVar44 = uVar80 + 3;
            iVar74 = iVar74 + iVar23 * 2;
            iVar31 = iVar31 + iVar23 * 2;
            uVar80 = uVar42;
          } while (lVar44 < (long)uVar47);
        }
        iVar31 = (int)uVar42;
        if (iVar31 < (int)local_11c) {
          lVar5 = *(long *)(local_148 + 0x160);
          pvVar6 = (this->weight_data_tm).data;
          sVar3 = (this->weight_data_tm).elemsize;
          sVar4 = (this->weight_data_tm).cstep;
          uVar42 = (ulong)iVar31;
          iVar31 = iVar31 * uVar82 * num_input;
          lVar34 = lVar41 * 4;
          do {
            uVar81 = (uint)uVar42;
            puVar59 = (undefined4 *)
                      ((ulong)((uVar81 & 1) + ((uint)(uVar42 >> 4) & 0xfffffff) +
                               (uint)((uVar81 >> 3 & 1) != 0) + ((uint)(uVar42 >> 2) & 1) +
                              (uint)((uVar81 >> 1 & 1) != 0)) * sVar3 * sVar4 + (long)pvVar6);
            if ((int)num_input < 0x10) {
              uVar80 = 0;
            }
            else {
              puVar29 = (undefined4 *)(lVar5 + (long)iVar31 * 4);
              uVar18 = 0;
              do {
                if (0 < (int)uVar82) {
                  uVar80 = 0;
                  puVar56 = puVar29;
                  do {
                    puVar50 = puVar59;
                    lVar67 = 0;
                    puVar59 = puVar56;
                    do {
                      *(undefined4 *)((long)puVar50 + lVar67) = *puVar59;
                      lVar67 = lVar67 + 4;
                      puVar59 = puVar59 + lVar41;
                    } while ((int)lVar67 != 0x40);
                    uVar80 = uVar80 + 1;
                    puVar56 = puVar56 + 1;
                    puVar59 = (undefined4 *)(lVar67 + (long)puVar50);
                  } while (uVar80 != uVar58);
                  puVar59 = (undefined4 *)((long)puVar50 + lVar67);
                }
                uVar80 = uVar18 + 0x10;
                lVar67 = uVar18 + 0x1f;
                puVar29 = puVar29 + uVar58 * 0x10;
                uVar18 = uVar80;
              } while (lVar67 < lVar72);
            }
            lVar67 = (long)iVar31 * 4;
            if ((int)((uint)uVar80 | 7) < (int)num_input) {
              puVar29 = (undefined4 *)(lVar34 * (uVar80 & 0xffffffff) + lVar67 + lVar5);
              uVar18 = uVar80 & 0xffffffff;
              do {
                if (0 < (int)uVar82) {
                  uVar80 = 0;
                  puVar56 = puVar29;
                  do {
                    puVar50 = puVar59;
                    lVar66 = 0;
                    puVar59 = puVar56;
                    do {
                      *(undefined4 *)((long)puVar50 + lVar66) = *puVar59;
                      lVar66 = lVar66 + 4;
                      puVar59 = puVar59 + lVar41;
                    } while ((int)lVar66 != 0x20);
                    uVar80 = uVar80 + 1;
                    puVar56 = puVar56 + 1;
                    puVar59 = (undefined4 *)(lVar66 + (long)puVar50);
                  } while (uVar80 != uVar58);
                  puVar59 = (undefined4 *)((long)puVar50 + lVar66);
                }
                uVar80 = uVar18 + 8;
                lVar66 = uVar18 + 0xf;
                puVar29 = puVar29 + lVar41 * 8;
                uVar18 = uVar80;
              } while (lVar66 < lVar72);
            }
            if ((int)((uint)uVar80 | 3) < (int)num_input) {
              puVar29 = (undefined4 *)(lVar34 * (uVar80 & 0xffffffff) + lVar67 + lVar5);
              uVar18 = uVar80 & 0xffffffff;
              do {
                if (0 < (int)uVar82) {
                  uVar80 = 0;
                  puVar56 = puVar29;
                  do {
                    puVar50 = puVar59;
                    lVar66 = 0;
                    puVar59 = puVar56;
                    do {
                      *(undefined4 *)((long)puVar50 + lVar66) = *puVar59;
                      lVar66 = lVar66 + 4;
                      puVar59 = puVar59 + lVar41;
                    } while ((int)lVar66 != 0x10);
                    uVar80 = uVar80 + 1;
                    puVar56 = puVar56 + 1;
                    puVar59 = (undefined4 *)(lVar66 + (long)puVar50);
                  } while (uVar80 != uVar58);
                  puVar59 = (undefined4 *)((long)puVar50 + lVar66);
                }
                uVar80 = uVar18 + 4;
                lVar66 = uVar18 + 7;
                puVar29 = puVar29 + lVar41 * 4;
                uVar18 = uVar80;
              } while (lVar66 < lVar72);
            }
            if ((int)((uint)uVar80 | 1) < (int)num_input) {
              uVar18 = (ulong)(int)(uint)uVar80;
              lVar66 = (uVar18 * 4 + 4) * lVar41 + lVar5 + lVar67;
              lVar60 = lVar34 * uVar18 + lVar67 + lVar5;
              do {
                if (0 < (int)uVar82) {
                  uVar80 = 0;
                  do {
                    *puVar59 = *(undefined4 *)(lVar60 + uVar80 * 4);
                    puVar59[1] = *(undefined4 *)(lVar66 + uVar80 * 4);
                    puVar59 = puVar59 + 2;
                    uVar80 = uVar80 + 1;
                  } while (uVar58 != uVar80);
                }
                uVar80 = uVar18 + 2;
                lVar35 = uVar18 + 3;
                lVar66 = lVar66 + lVar41 * 8;
                lVar60 = lVar60 + lVar41 * 8;
                uVar18 = uVar80;
              } while (lVar35 < lVar72);
            }
            if ((int)uVar80 < (int)num_input) {
              lVar66 = (long)(int)uVar80;
              lVar67 = lVar34 * lVar66 + lVar67 + lVar5;
              do {
                if (0 < (int)uVar82) {
                  lVar60 = 0;
                  do {
                    *(undefined4 *)((long)puVar59 + lVar60) = *(undefined4 *)(lVar67 + lVar60);
                    lVar60 = lVar60 + 4;
                  } while (uVar58 * 4 - lVar60 != 0);
                  puVar59 = (undefined4 *)((long)puVar59 + lVar60);
                }
                lVar66 = lVar66 + 1;
                lVar67 = lVar67 + lVar34;
              } while (lVar66 != lVar72);
            }
            uVar42 = uVar42 + 1;
            iVar31 = iVar31 + uVar82 * num_input;
          } while (uVar42 != uVar47);
        }
      }
      else {
        bVar86 = iVar51 == 8;
        if ((iVar74 == 8) && (iVar51 == 8)) {
          bVar86 = true;
          bVar11 = false;
          if (iVar31 == 2) {
            if (iVar23 == 2) goto LAB_001ca8b8;
          }
          else if ((iVar31 == 3) && (iVar23 == 3)) {
LAB_001ca8b8:
            if ((iVar46 == 1) && ((iVar62 == 1 && (iVar64 == 1)))) {
              bVar10 = false;
              goto LAB_001ca8cd;
            }
          }
          bVar10 = false;
          goto LAB_001caaa1;
        }
        bVar11 = iVar51 == 1;
        if (((((iVar74 != 8) || (iVar51 != 1)) || (iVar31 != 3)) || ((iVar23 != 3 || (iVar46 != 1)))
            ) || (iVar62 != 1)) goto LAB_001caaa1;
        bVar11 = true;
        if (iVar64 == 2) {
          if (iVar14 != 2) goto LAB_001caa9b;
        }
        else if ((iVar64 != 1) || (iVar14 != 1)) {
LAB_001caa9b:
          bVar10 = false;
          goto LAB_001caa9e;
        }
LAB_001caae7:
        convolution_transform_kernel_packed_sse
                  ((Mat *)(p_Var39 + 0x160),&this->weight_data_tm,num_input,uVar81,iVar31,iVar23,
                   iVar51,iVar74);
      }
    }
    if (opt->lightmode != true) {
      return 0;
    }
    p_Var8 = this->_vptr_Convolution_x86_avx512[-3];
    p_Var39 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx512 + (long)p_Var8);
    p_Var78 = (_func_int *)((long)&(this->weight_winograd63_data).dims + (long)p_Var8);
    piVar2 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var8);
    if (piVar2 == (int *)0x0) goto LAB_001cabab;
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 != 0) goto LAB_001cabab;
    pvVar6 = *(void **)(p_Var39 + 0x160);
    plVar7 = *(long **)(p_Var39 + 0x180);
  }
  else {
    if (((((iVar23 != 3) || (iVar31 != 3)) || (opt->use_winograd_convolution == false)) ||
        (((int)uVar81 < 9 && (int)num_input < 9 ||
         (*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var39) != 1)))) ||
       ((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var39) != 1 ||
        ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var39) != 1 ||
         (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var39) != 1))))))
    goto LAB_001c9f8b;
    lVar41 = *(long *)((long)&(this->weight_sgemm_data).cstep + (long)p_Var39);
    if ((lVar41 == *(long *)((long)&(this->weight_winograd23_data).data + (long)p_Var39)) ||
       ((*(int *)(lVar41 + 0x2c) == 0 || (*(int *)(lVar41 + 0x30) == 0)))) {
      lVar72 = *(long *)((long)&(this->weight_winograd23_data).elemsize + (long)p_Var39);
      lVar34 = *(long *)((long)&(this->weight_winograd23_data).elempack + (long)p_Var39);
      if ((lVar72 != lVar34) && ((*(int *)(lVar72 + 0x2c) != 0 && (*(int *)(lVar72 + 0x30) != 0))))
      goto LAB_001ca888;
      if (((int)uVar81 < 0x21) &&
         ((opt->use_winograd63_convolution != false && ((int)num_input < 0x21)))) {
LAB_001cec62:
        conv3x3s1_winograd63_transform_kernel
                  ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var39),
                   &this->weight_winograd63_data,num_input,uVar81,opt);
      }
      else {
        if (opt->use_winograd43_convolution != true) goto LAB_001ce89f;
LAB_001ce86b:
        conv3x3s1_winograd43_transform_kernel
                  ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var39),
                   &this->weight_winograd43_data,num_input,uVar81,opt);
      }
    }
    else {
      lVar72 = *(long *)((long)&(this->weight_winograd23_data).elemsize + (long)p_Var39);
      lVar34 = *(long *)((long)&(this->weight_winograd23_data).elempack + (long)p_Var39);
LAB_001ca888:
      if (((lVar72 == lVar34) || (iVar31 = *(int *)(lVar72 + 0x2c), iVar31 == 0)) ||
         (iVar23 = *(int *)(lVar72 + 0x30), iVar23 == 0)) {
        iVar31 = *(int *)(lVar41 + 0x2c);
        iVar23 = *(int *)(lVar41 + 0x30);
        iVar74 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var39 + 4));
        iVar46 = *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var39);
        if (((iVar46 < 1 && iVar74 < 1) &&
            (iVar62 = *(int *)((long)&(this->weight_winograd43_data).data + (long)(p_Var39 + 4)),
            iVar62 < 1)) &&
           (iVar64 = *(int *)((long)&(this->weight_winograd43_data).refcount + (long)p_Var39),
           iVar64 < 1)) {
          if ((iVar64 == -0xe9 && (iVar62 == -0xe9 && (iVar46 == -0xe9 && iVar74 == -0xe9))) ||
             (iVar64 == -0xea && (iVar62 == -0xea && (iVar46 == -0xea && iVar74 == -0xea))))
          goto LAB_001ca8a7;
        }
        else {
          iVar31 = iVar74 + iVar31 + iVar46;
          iVar23 = iVar23 + *(int *)((long)&(this->weight_winograd43_data).data +
                                    (long)(p_Var39 + 4)) +
                   *(int *)((long)&(this->weight_winograd43_data).refcount + (long)p_Var39);
        }
      }
      else {
LAB_001ca8a7:
        iVar31 = iVar31 + 2;
        iVar23 = iVar23 + 2;
      }
      bVar10 = test_prefer_winograd63(num_input,uVar81,iVar31,iVar23);
      bVar11 = test_prefer_winograd23(num_input,uVar81,iVar31,iVar23);
      bVar22 = bVar11 & bVar30;
      if (!bVar11) {
        bVar30 = bVar10;
      }
      if (bVar10) {
        bVar12 = opt->use_winograd63_convolution;
        if ((bVar30 & bVar12) == 0) goto LAB_001ce84c;
LAB_001cc51b:
        if (bVar22 == 0) {
          if (bVar10) goto LAB_001cec62;
          goto LAB_001cec6d;
        }
      }
      else {
        if (bVar30 != 0) goto LAB_001cc51b;
        bVar12 = 0;
LAB_001ce84c:
        if (opt->use_winograd43_convolution == false) {
          if (bVar22 == 0 && opt->use_winograd63_convolution == true) {
            if (bVar12 != 0 || opt->use_winograd63_convolution != false) goto LAB_001cec62;
            goto LAB_001cec6d;
          }
        }
        else if (bVar22 == 0) goto LAB_001ce86b;
      }
LAB_001ce89f:
      conv3x3s1_winograd23_transform_kernel
                ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var39),
                 &this->weight_winograd23_data,num_input,uVar81,opt);
    }
LAB_001cec6d:
    if (opt->lightmode != true) {
      return 0;
    }
    p_Var8 = this->_vptr_Convolution_x86_avx512[-3];
    p_Var39 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx512 + (long)p_Var8);
    p_Var78 = (_func_int *)((long)&(this->weight_winograd63_data).dims + (long)p_Var8);
    piVar2 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var8);
    if (piVar2 == (int *)0x0) goto LAB_001cabab;
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 != 0) goto LAB_001cabab;
    pvVar6 = *(void **)(p_Var39 + 0x160);
    plVar7 = *(long **)(p_Var39 + 0x180);
  }
  if (plVar7 == (long *)0x0) {
    if (pvVar6 != (void *)0x0) {
      free(pvVar6);
    }
  }
  else {
    (**(code **)(*plVar7 + 0x18))();
  }
LAB_001cabab:
  *(undefined8 *)(p_Var39 + 0x1a0) = 0;
  *(undefined8 *)(p_Var78 + 0xc) = 0;
  *(undefined8 *)(p_Var78 + 0x14) = 0;
  *(undefined8 *)p_Var78 = 0;
  *(undefined8 *)(p_Var78 + 8) = 0;
  *(undefined8 *)(p_Var39 + 0x188) = 0;
  *(undefined8 *)(p_Var39 + 400) = 0;
  *(undefined4 *)(p_Var39 + 0x198) = 0;
  return 0;
}

Assistant:

int Convolution_x86_avx512::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);
    nT = opt.num_threads;

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if ((bottom_shapes.empty() || bottom_shapes[0].w == 0 || bottom_shapes[0].h == 0) && (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0))
        {
            // dynamic shape
            if ((opt.use_winograd63_convolution) && (num_input <= 32 && num_output <= 32))
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if (opt.use_winograd43_convolution)
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            int w;
            int h;
            if (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0)
            {
                w = bottom_shapes[0].w;
                h = bottom_shapes[0].h;

                // make padding
                if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
                {
                    w += pad_left + pad_right;
                    h += pad_top + pad_bottom;
                }
                else if ((pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
                         || (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234))
                {
                    // tensorflow padding=SAME or onnx padding=SAME_UPPER/SAME_LOWER
                    w += 2;
                    h += 2;
                }
            }
            else
            {
                w = top_shapes[0].w + 2;
                h = top_shapes[0].h + 2;
            }

            bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
            bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
            bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

            if (prefer_winograd23 && !opt.use_winograd23_convolution)
            {
                // f23 fallback to f43
                prefer_winograd23 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd63 && !opt.use_winograd63_convolution)
            {
                // f63 fallback to f43
                prefer_winograd63 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd43 && !opt.use_winograd43_convolution)
            {
                // f43 fallback to f63 or f23
                prefer_winograd43 = false;
                if (opt.use_winograd63_convolution)
                {
                    prefer_winograd63 = true;
                }
                else
                {
                    prefer_winograd23 = true;
                }
            }

            if (prefer_winograd23)
            {
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
            else if (prefer_winograd43)
            {
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else if (prefer_winograd63)
            {
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                // should never reach here
            }
        }

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else
    {
        if ((elempack == 16 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 8 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 8 && out_elempack == 8 && kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
                || (elempack == 8 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2))
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else
        {
            convolution_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}